

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined8 unaff_R13;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar49 [16];
  undefined1 auVar77 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar54 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  float fVar104;
  undefined4 uVar105;
  vfloat4 a0_2;
  float fVar112;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float t1;
  undefined1 auVar116 [16];
  vfloat4 b0;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  vfloat4 a0_3;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  __m128 a_1;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar165;
  undefined1 auVar164 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar168 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar175 [16];
  undefined1 auVar184 [32];
  __m128 a;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  float fVar203;
  float fVar205;
  float fVar207;
  undefined1 auVar194 [16];
  float fVar204;
  float fVar206;
  float fVar208;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar219;
  float fVar220;
  vfloat4 a0_1;
  float fVar221;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  vfloat4 a0;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint auStack_460 [4];
  RTCFilterFunctionNArguments local_450;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [8];
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar32;
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar229 [32];
  
  uVar31 = (ulong)(byte)prim[1];
  fVar210 = *(float *)(prim + uVar31 * 0x19 + 0x12);
  auVar41 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar49 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar43 = vsubps_avx(auVar41,*(undefined1 (*) [16])(prim + uVar31 * 0x19 + 6));
  fVar125 = fVar210 * auVar43._0_4_;
  fVar104 = fVar210 * auVar49._0_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar31 * 4 + 6);
  auVar74 = vpmovsxbd_avx2(auVar41);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar31 * 5 + 6);
  auVar71 = vpmovsxbd_avx2(auVar45);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar31 * 6 + 6);
  auVar72 = vpmovsxbd_avx2(auVar5);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar31 * 0xb + 6);
  auVar87 = vpmovsxbd_avx2(auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar31 * 0xc + 6);
  auVar88 = vpmovsxbd_avx2(auVar51);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar31 * 0xd + 6);
  auVar73 = vpmovsxbd_avx2(auVar47);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar31 * 0x12 + 6);
  auVar79 = vpmovsxbd_avx2(auVar48);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar31 * 0x13 + 6);
  auVar82 = vpmovsxbd_avx2(auVar42);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar80 = vcvtdq2ps_avx(auVar82);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar31 * 0x14 + 6);
  auVar69 = vpmovsxbd_avx2(auVar46);
  auVar81 = vcvtdq2ps_avx(auVar69);
  auVar136._4_4_ = fVar104;
  auVar136._0_4_ = fVar104;
  auVar136._8_4_ = fVar104;
  auVar136._12_4_ = fVar104;
  auVar136._16_4_ = fVar104;
  auVar136._20_4_ = fVar104;
  auVar136._24_4_ = fVar104;
  auVar136._28_4_ = fVar104;
  auVar236._8_4_ = 1;
  auVar236._0_8_ = 0x100000001;
  auVar236._12_4_ = 1;
  auVar236._16_4_ = 1;
  auVar236._20_4_ = 1;
  auVar236._24_4_ = 1;
  auVar236._28_4_ = 1;
  auVar83 = ZEXT1632(CONCAT412(fVar210 * auVar49._12_4_,
                               CONCAT48(fVar210 * auVar49._8_4_,
                                        CONCAT44(fVar210 * auVar49._4_4_,fVar104))));
  auVar70 = vpermps_avx2(auVar236,auVar83);
  auVar67 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar245 = ZEXT3264(auVar67);
  auVar68 = vpermps_avx512vl(auVar67,auVar83);
  fVar104 = auVar68._0_4_;
  fVar204 = auVar68._4_4_;
  auVar83._4_4_ = fVar204 * auVar72._4_4_;
  auVar83._0_4_ = fVar104 * auVar72._0_4_;
  fVar206 = auVar68._8_4_;
  auVar83._8_4_ = fVar206 * auVar72._8_4_;
  fVar112 = auVar68._12_4_;
  auVar83._12_4_ = fVar112 * auVar72._12_4_;
  fVar113 = auVar68._16_4_;
  auVar83._16_4_ = fVar113 * auVar72._16_4_;
  fVar114 = auVar68._20_4_;
  auVar83._20_4_ = fVar114 * auVar72._20_4_;
  fVar115 = auVar68._24_4_;
  auVar83._24_4_ = fVar115 * auVar72._24_4_;
  auVar83._28_4_ = auVar82._28_4_;
  auVar82._4_4_ = auVar73._4_4_ * fVar204;
  auVar82._0_4_ = auVar73._0_4_ * fVar104;
  auVar82._8_4_ = auVar73._8_4_ * fVar206;
  auVar82._12_4_ = auVar73._12_4_ * fVar112;
  auVar82._16_4_ = auVar73._16_4_ * fVar113;
  auVar82._20_4_ = auVar73._20_4_ * fVar114;
  auVar82._24_4_ = auVar73._24_4_ * fVar115;
  auVar82._28_4_ = auVar69._28_4_;
  auVar69._4_4_ = auVar81._4_4_ * fVar204;
  auVar69._0_4_ = auVar81._0_4_ * fVar104;
  auVar69._8_4_ = auVar81._8_4_ * fVar206;
  auVar69._12_4_ = auVar81._12_4_ * fVar112;
  auVar69._16_4_ = auVar81._16_4_ * fVar113;
  auVar69._20_4_ = auVar81._20_4_ * fVar114;
  auVar69._24_4_ = auVar81._24_4_ * fVar115;
  auVar69._28_4_ = auVar68._28_4_;
  auVar41 = vfmadd231ps_fma(auVar83,auVar70,auVar71);
  auVar45 = vfmadd231ps_fma(auVar82,auVar70,auVar88);
  auVar5 = vfmadd231ps_fma(auVar69,auVar80,auVar70);
  auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar136,auVar74);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar136,auVar87);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar79,auVar136);
  auVar149._4_4_ = fVar125;
  auVar149._0_4_ = fVar125;
  auVar149._8_4_ = fVar125;
  auVar149._12_4_ = fVar125;
  auVar149._16_4_ = fVar125;
  auVar149._20_4_ = fVar125;
  auVar149._24_4_ = fVar125;
  auVar149._28_4_ = fVar125;
  auVar69 = ZEXT1632(CONCAT412(fVar210 * auVar43._12_4_,
                               CONCAT48(fVar210 * auVar43._8_4_,
                                        CONCAT44(fVar210 * auVar43._4_4_,fVar125))));
  auVar82 = vpermps_avx2(auVar236,auVar69);
  auVar69 = vpermps_avx512vl(auVar67,auVar69);
  auVar70 = vmulps_avx512vl(auVar69,auVar72);
  auVar85._0_4_ = auVar69._0_4_ * auVar73._0_4_;
  auVar85._4_4_ = auVar69._4_4_ * auVar73._4_4_;
  auVar85._8_4_ = auVar69._8_4_ * auVar73._8_4_;
  auVar85._12_4_ = auVar69._12_4_ * auVar73._12_4_;
  auVar85._16_4_ = auVar69._16_4_ * auVar73._16_4_;
  auVar85._20_4_ = auVar69._20_4_ * auVar73._20_4_;
  auVar85._24_4_ = auVar69._24_4_ * auVar73._24_4_;
  auVar85._28_4_ = 0;
  auVar73._4_4_ = auVar69._4_4_ * auVar81._4_4_;
  auVar73._0_4_ = auVar69._0_4_ * auVar81._0_4_;
  auVar73._8_4_ = auVar69._8_4_ * auVar81._8_4_;
  auVar73._12_4_ = auVar69._12_4_ * auVar81._12_4_;
  auVar73._16_4_ = auVar69._16_4_ * auVar81._16_4_;
  auVar73._20_4_ = auVar69._20_4_ * auVar81._20_4_;
  auVar73._24_4_ = auVar69._24_4_ * auVar81._24_4_;
  auVar73._28_4_ = auVar72._28_4_;
  auVar71 = vfmadd231ps_avx512vl(auVar70,auVar82,auVar71);
  auVar50 = vfmadd231ps_fma(auVar85,auVar82,auVar88);
  auVar51 = vfmadd231ps_fma(auVar73,auVar82,auVar80);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar149,auVar74);
  auVar237 = ZEXT3264(auVar71);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar149,auVar87);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar149,auVar79);
  auVar89._8_4_ = 0x7fffffff;
  auVar89._0_8_ = 0x7fffffff7fffffff;
  auVar89._12_4_ = 0x7fffffff;
  auVar89._16_4_ = 0x7fffffff;
  auVar89._20_4_ = 0x7fffffff;
  auVar89._24_4_ = 0x7fffffff;
  auVar89._28_4_ = 0x7fffffff;
  auVar74 = vandps_avx(ZEXT1632(auVar41),auVar89);
  auVar91._8_4_ = 0x219392ef;
  auVar91._0_8_ = 0x219392ef219392ef;
  auVar91._12_4_ = 0x219392ef;
  auVar91._16_4_ = 0x219392ef;
  auVar91._20_4_ = 0x219392ef;
  auVar91._24_4_ = 0x219392ef;
  auVar91._28_4_ = 0x219392ef;
  uVar36 = vcmpps_avx512vl(auVar74,auVar91,1);
  bVar12 = (bool)((byte)uVar36 & 1);
  auVar70._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar41._0_4_;
  bVar12 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar41._4_4_;
  bVar12 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar41._8_4_;
  bVar12 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar41._12_4_;
  auVar70._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar70._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar70._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar70._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar45),auVar89);
  uVar36 = vcmpps_avx512vl(auVar74,auVar91,1);
  bVar12 = (bool)((byte)uVar36 & 1);
  auVar67._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar45._0_4_;
  bVar12 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar45._4_4_;
  bVar12 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar45._8_4_;
  bVar12 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar45._12_4_;
  auVar67._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar67._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar67._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar67._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar5),auVar89);
  uVar36 = vcmpps_avx512vl(auVar74,auVar91,1);
  bVar12 = (bool)((byte)uVar36 & 1);
  auVar74._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar5._0_4_;
  bVar12 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar5._4_4_;
  bVar12 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar5._8_4_;
  bVar12 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar5._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar72 = vrcp14ps_avx512vl(auVar70);
  auVar90._8_4_ = 0x3f800000;
  auVar90._0_8_ = 0x3f8000003f800000;
  auVar90._12_4_ = 0x3f800000;
  auVar90._16_4_ = 0x3f800000;
  auVar90._20_4_ = 0x3f800000;
  auVar90._24_4_ = 0x3f800000;
  auVar90._28_4_ = 0x3f800000;
  auVar41 = vfnmadd213ps_fma(auVar70,auVar72,auVar90);
  auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar67);
  auVar45 = vfnmadd213ps_fma(auVar67,auVar72,auVar90);
  auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar74);
  auVar5 = vfnmadd213ps_fma(auVar74,auVar72,auVar90);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 7 + 6));
  auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar72,auVar72);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar72 = vsubps_avx512vl(auVar74,auVar71);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 9 + 6));
  auVar79._4_4_ = auVar41._4_4_ * auVar72._4_4_;
  auVar79._0_4_ = auVar41._0_4_ * auVar72._0_4_;
  auVar79._8_4_ = auVar41._8_4_ * auVar72._8_4_;
  auVar79._12_4_ = auVar41._12_4_ * auVar72._12_4_;
  auVar79._16_4_ = auVar72._16_4_ * 0.0;
  auVar79._20_4_ = auVar72._20_4_ * 0.0;
  auVar79._24_4_ = auVar72._24_4_ * 0.0;
  auVar79._28_4_ = auVar72._28_4_;
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar71 = vsubps_avx512vl(auVar74,auVar71);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0xe + 6));
  auVar86._0_4_ = auVar41._0_4_ * auVar71._0_4_;
  auVar86._4_4_ = auVar41._4_4_ * auVar71._4_4_;
  auVar86._8_4_ = auVar41._8_4_ * auVar71._8_4_;
  auVar86._12_4_ = auVar41._12_4_ * auVar71._12_4_;
  auVar86._16_4_ = auVar71._16_4_ * 0.0;
  auVar86._20_4_ = auVar71._20_4_ * 0.0;
  auVar86._24_4_ = auVar71._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar50));
  auVar80._4_4_ = auVar45._4_4_ * auVar74._4_4_;
  auVar80._0_4_ = auVar45._0_4_ * auVar74._0_4_;
  auVar80._8_4_ = auVar45._8_4_ * auVar74._8_4_;
  auVar80._12_4_ = auVar45._12_4_ * auVar74._12_4_;
  auVar80._16_4_ = auVar74._16_4_ * 0.0;
  auVar80._20_4_ = auVar74._20_4_ * 0.0;
  auVar80._24_4_ = auVar74._24_4_ * 0.0;
  auVar80._28_4_ = auVar74._28_4_;
  auVar73 = vpbroadcastd_avx512vl();
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar50));
  auVar84._0_4_ = auVar45._0_4_ * auVar74._0_4_;
  auVar84._4_4_ = auVar45._4_4_ * auVar74._4_4_;
  auVar84._8_4_ = auVar45._8_4_ * auVar74._8_4_;
  auVar84._12_4_ = auVar45._12_4_ * auVar74._12_4_;
  auVar84._16_4_ = auVar74._16_4_ * 0.0;
  auVar84._20_4_ = auVar74._20_4_ * 0.0;
  auVar84._24_4_ = auVar74._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x15 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar51));
  auVar81._4_4_ = auVar74._4_4_ * auVar5._4_4_;
  auVar81._0_4_ = auVar74._0_4_ * auVar5._0_4_;
  auVar81._8_4_ = auVar74._8_4_ * auVar5._8_4_;
  auVar81._12_4_ = auVar74._12_4_ * auVar5._12_4_;
  auVar81._16_4_ = auVar74._16_4_ * 0.0;
  auVar81._20_4_ = auVar74._20_4_ * 0.0;
  auVar81._24_4_ = auVar74._24_4_ * 0.0;
  auVar81._28_4_ = auVar74._28_4_;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x17 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar51));
  auVar68._0_4_ = auVar5._0_4_ * auVar74._0_4_;
  auVar68._4_4_ = auVar5._4_4_ * auVar74._4_4_;
  auVar68._8_4_ = auVar5._8_4_ * auVar74._8_4_;
  auVar68._12_4_ = auVar5._12_4_ * auVar74._12_4_;
  auVar68._16_4_ = auVar74._16_4_ * 0.0;
  auVar68._20_4_ = auVar74._20_4_ * 0.0;
  auVar68._24_4_ = auVar74._24_4_ * 0.0;
  auVar68._28_4_ = 0;
  auVar74 = vpminsd_avx2(auVar79,auVar86);
  auVar71 = vpminsd_avx2(auVar80,auVar84);
  auVar74 = vmaxps_avx(auVar74,auVar71);
  auVar71 = vpminsd_avx2(auVar81,auVar68);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar72._4_4_ = uVar105;
  auVar72._0_4_ = uVar105;
  auVar72._8_4_ = uVar105;
  auVar72._12_4_ = uVar105;
  auVar72._16_4_ = uVar105;
  auVar72._20_4_ = uVar105;
  auVar72._24_4_ = uVar105;
  auVar72._28_4_ = uVar105;
  auVar71 = vmaxps_avx512vl(auVar71,auVar72);
  auVar74 = vmaxps_avx(auVar74,auVar71);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  auVar71._16_4_ = 0x3f7ffffa;
  auVar71._20_4_ = 0x3f7ffffa;
  auVar71._24_4_ = 0x3f7ffffa;
  auVar71._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar74,auVar71);
  auVar74 = vpmaxsd_avx2(auVar79,auVar86);
  auVar71 = vpmaxsd_avx2(auVar80,auVar84);
  auVar74 = vminps_avx(auVar74,auVar71);
  auVar71 = vpmaxsd_avx2(auVar81,auVar68);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar87._4_4_ = uVar105;
  auVar87._0_4_ = uVar105;
  auVar87._8_4_ = uVar105;
  auVar87._12_4_ = uVar105;
  auVar87._16_4_ = uVar105;
  auVar87._20_4_ = uVar105;
  auVar87._24_4_ = uVar105;
  auVar87._28_4_ = uVar105;
  auVar71 = vminps_avx512vl(auVar71,auVar87);
  auVar74 = vminps_avx(auVar74,auVar71);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar88);
  uVar17 = vcmpps_avx512vl(local_1c0,auVar74,2);
  uVar18 = vpcmpgtd_avx512vl(auVar73,_DAT_01fb4ba0);
  uVar36 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar17 & (byte)uVar18));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar238 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar240 = ZEXT1664(auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar241 = ZEXT1664(auVar41);
  auVar247 = ZEXT464(0x3f800000);
  auVar41 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar246 = ZEXT1664(auVar41);
LAB_01a319ae:
  if (uVar36 == 0) {
LAB_01a334e2:
    return uVar36 != 0;
  }
  lVar33 = 0;
  for (uVar31 = uVar36; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    lVar33 = lVar33 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  uVar31 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar33 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar41 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * uVar31);
  lVar33 = uVar31 + 1;
  auVar45 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * lVar33);
  _Var10 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar5 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * uVar31);
  auVar50 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * lVar33);
  local_1e0 = vpbroadcastd_avx512vl();
  auVar51 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar230._8_4_ = 0x3eaaaaab;
  auVar230._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar230._12_4_ = 0x3eaaaaab;
  auVar47 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar8[2].intersectionFilterN +
                             (long)pGVar8[2].pointQueryFunc * uVar31),auVar41,auVar230);
  auVar46 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar8[2].intersectionFilterN +
                              (long)pGVar8[2].pointQueryFunc * lVar33),auVar45,auVar230);
  auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar8[3].userPtr +
                             uVar31 * *(long *)&pGVar8[3].fnumTimeSegments),auVar5,auVar230);
  auVar49 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar8[3].userPtr +
                              *(long *)&pGVar8[3].fnumTimeSegments * lVar33),auVar50,auVar230);
  auVar76._16_16_ = local_1e0._16_16_;
  auVar76._0_16_ = vxorps_avx512vl(auVar237._0_16_,auVar237._0_16_);
  auVar42 = vmulps_avx512vl(auVar45,auVar76._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar46,auVar76._0_16_);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar47,auVar43);
  auVar166._0_4_ = auVar42._0_4_ + auVar41._0_4_;
  auVar166._4_4_ = auVar42._4_4_ + auVar41._4_4_;
  auVar166._8_4_ = auVar42._8_4_ + auVar41._8_4_;
  auVar166._12_4_ = auVar42._12_4_ + auVar41._12_4_;
  auVar106 = auVar238._0_16_;
  auVar42 = vfmadd231ps_avx512vl(auVar43,auVar47,auVar106);
  auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar41,auVar106);
  auVar42 = vmulps_avx512vl(auVar50,auVar76._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar42,auVar49,auVar76._0_16_);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar48,auVar44);
  auVar222._0_4_ = auVar42._0_4_ + auVar5._0_4_;
  auVar222._4_4_ = auVar42._4_4_ + auVar5._4_4_;
  auVar222._8_4_ = auVar42._8_4_ + auVar5._8_4_;
  auVar222._12_4_ = auVar42._12_4_ + auVar5._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar44,auVar48,auVar106);
  auVar44 = vfnmadd231ps_avx512vl(auVar42,auVar5,auVar106);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar46,auVar45);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar47,auVar76._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar41,auVar76._0_16_);
  auVar45 = vmulps_avx512vl(auVar45,auVar106);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar106,auVar46);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar76._0_16_,auVar47);
  auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar76._0_16_,auVar41);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar49,auVar50);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar48,auVar76._0_16_);
  auVar47 = vfmadd231ps_avx512vl(auVar41,auVar5,auVar76._0_16_);
  auVar41 = vmulps_avx512vl(auVar50,auVar106);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar106,auVar49);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar76._0_16_,auVar48);
  auVar48 = vfnmadd231ps_avx512vl(auVar41,auVar76._0_16_,auVar5);
  auVar41 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar45 = vshufps_avx(auVar222,auVar222,0xc9);
  fVar125 = auVar43._0_4_;
  auVar64._0_4_ = fVar125 * auVar45._0_4_;
  fVar165 = auVar43._4_4_;
  auVar64._4_4_ = fVar165 * auVar45._4_4_;
  fVar208 = auVar43._8_4_;
  auVar64._8_4_ = fVar208 * auVar45._8_4_;
  fVar209 = auVar43._12_4_;
  auVar64._12_4_ = fVar209 * auVar45._12_4_;
  auVar45 = vfmsub231ps_fma(auVar64,auVar41,auVar222);
  auVar5 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar139._0_4_ = fVar125 * auVar45._0_4_;
  auVar139._4_4_ = fVar165 * auVar45._4_4_;
  auVar139._8_4_ = fVar208 * auVar45._8_4_;
  auVar139._12_4_ = fVar209 * auVar45._12_4_;
  auVar41 = vfmsub231ps_fma(auVar139,auVar41,auVar44);
  auVar50 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar45 = vshufps_avx(auVar47,auVar47,0xc9);
  fVar210 = auVar46._0_4_;
  auVar185._0_4_ = auVar45._0_4_ * fVar210;
  fVar104 = auVar46._4_4_;
  auVar185._4_4_ = auVar45._4_4_ * fVar104;
  fVar204 = auVar46._8_4_;
  auVar185._8_4_ = auVar45._8_4_ * fVar204;
  fVar206 = auVar46._12_4_;
  auVar185._12_4_ = auVar45._12_4_ * fVar206;
  auVar45 = vfmsub231ps_fma(auVar185,auVar41,auVar47);
  auVar47 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar186._0_4_ = auVar45._0_4_ * fVar210;
  auVar186._4_4_ = auVar45._4_4_ * fVar104;
  auVar186._8_4_ = auVar45._8_4_ * fVar204;
  auVar186._12_4_ = auVar45._12_4_ * fVar206;
  auVar41 = vfmsub231ps_fma(auVar186,auVar41,auVar48);
  auVar48 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar41 = vdpps_avx(auVar5,auVar5,0x7f);
  fVar112 = auVar41._0_4_;
  auVar75._4_28_ = auVar76._4_28_;
  auVar75._0_4_ = fVar112;
  auVar45 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar75._0_16_);
  auVar49 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar44 = vmulss_avx512f(auVar41,ZEXT416(0x3f000000));
  fVar113 = auVar45._0_4_;
  fVar114 = auVar49._0_4_ - auVar44._0_4_ * fVar113 * fVar113 * fVar113;
  fVar211 = fVar114 * auVar5._0_4_;
  fVar219 = fVar114 * auVar5._4_4_;
  fVar220 = fVar114 * auVar5._8_4_;
  fVar221 = fVar114 * auVar5._12_4_;
  auVar45 = vdpps_avx(auVar5,auVar50,0x7f);
  auVar140._0_4_ = fVar112 * auVar50._0_4_;
  auVar140._4_4_ = fVar112 * auVar50._4_4_;
  auVar140._8_4_ = fVar112 * auVar50._8_4_;
  auVar140._12_4_ = fVar112 * auVar50._12_4_;
  fVar112 = auVar45._0_4_;
  auVar65._0_4_ = fVar112 * auVar5._0_4_;
  auVar65._4_4_ = fVar112 * auVar5._4_4_;
  auVar65._8_4_ = fVar112 * auVar5._8_4_;
  auVar65._12_4_ = fVar112 * auVar5._12_4_;
  auVar5 = vsubps_avx(auVar140,auVar65);
  auVar45 = vrcp14ss_avx512f(auVar76._0_16_,auVar75._0_16_);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar45,ZEXT416(0x40000000));
  fVar112 = auVar45._0_4_ * auVar41._0_4_;
  auVar41 = vdpps_avx(auVar47,auVar47,0x7f);
  fVar113 = auVar41._0_4_;
  auVar78._16_16_ = auVar76._16_16_;
  auVar78._0_16_ = auVar76._0_16_;
  auVar77._4_28_ = auVar78._4_28_;
  auVar77._0_4_ = fVar113;
  auVar45 = vrsqrt14ss_avx512f(auVar76._0_16_,auVar77._0_16_);
  auVar50 = vmulss_avx512f(auVar45,ZEXT416(0x3fc00000));
  auVar49 = vmulss_avx512f(auVar41,ZEXT416(0x3f000000));
  fVar115 = auVar45._0_4_;
  fVar115 = auVar50._0_4_ - auVar49._0_4_ * fVar115 * fVar115 * fVar115;
  fVar193 = fVar115 * auVar47._0_4_;
  fVar203 = fVar115 * auVar47._4_4_;
  fVar205 = fVar115 * auVar47._8_4_;
  fVar207 = fVar115 * auVar47._12_4_;
  auVar45 = vdpps_avx(auVar47,auVar48,0x7f);
  auVar57._0_4_ = fVar113 * auVar48._0_4_;
  auVar57._4_4_ = fVar113 * auVar48._4_4_;
  auVar57._8_4_ = fVar113 * auVar48._8_4_;
  auVar57._12_4_ = fVar113 * auVar48._12_4_;
  fVar113 = auVar45._0_4_;
  auVar44._0_4_ = fVar113 * auVar47._0_4_;
  auVar44._4_4_ = fVar113 * auVar47._4_4_;
  auVar44._8_4_ = fVar113 * auVar47._8_4_;
  auVar44._12_4_ = fVar113 * auVar47._12_4_;
  auVar50 = vsubps_avx(auVar57,auVar44);
  auVar45 = vrcp14ss_avx512f(auVar76._0_16_,auVar77._0_16_);
  auVar41 = vfnmadd213ss_avx512f(auVar41,auVar45,ZEXT416(0x40000000));
  fVar113 = auVar45._0_4_ * auVar41._0_4_;
  auVar41 = vshufps_avx(auVar166,auVar166,0xff);
  auVar132._0_4_ = fVar211 * auVar41._0_4_;
  auVar132._4_4_ = fVar219 * auVar41._4_4_;
  auVar132._8_4_ = fVar220 * auVar41._8_4_;
  auVar132._12_4_ = fVar221 * auVar41._12_4_;
  local_350 = vsubps_avx(auVar166,auVar132);
  auVar45 = vshufps_avx(auVar43,auVar43,0xff);
  auVar58._0_4_ = fVar211 * auVar45._0_4_ + auVar41._0_4_ * fVar114 * auVar5._0_4_ * fVar112;
  auVar58._4_4_ = fVar219 * auVar45._4_4_ + auVar41._4_4_ * fVar114 * auVar5._4_4_ * fVar112;
  auVar58._8_4_ = fVar220 * auVar45._8_4_ + auVar41._8_4_ * fVar114 * auVar5._8_4_ * fVar112;
  auVar58._12_4_ = fVar221 * auVar45._12_4_ + auVar41._12_4_ * fVar114 * auVar5._12_4_ * fVar112;
  auVar5 = vsubps_avx(auVar43,auVar58);
  local_360._0_4_ = auVar166._0_4_ + auVar132._0_4_;
  local_360._4_4_ = auVar166._4_4_ + auVar132._4_4_;
  fStack_358 = auVar166._8_4_ + auVar132._8_4_;
  fStack_354 = auVar166._12_4_ + auVar132._12_4_;
  auVar41 = vshufps_avx(auVar42,auVar42,0xff);
  auVar141._0_4_ = fVar193 * auVar41._0_4_;
  auVar141._4_4_ = fVar203 * auVar41._4_4_;
  auVar141._8_4_ = fVar205 * auVar41._8_4_;
  auVar141._12_4_ = fVar207 * auVar41._12_4_;
  local_370 = vsubps_avx512vl(auVar42,auVar141);
  auVar45 = vshufps_avx(auVar46,auVar46,0xff);
  auVar43._0_4_ = fVar193 * auVar45._0_4_ + auVar41._0_4_ * fVar115 * auVar50._0_4_ * fVar113;
  auVar43._4_4_ = fVar203 * auVar45._4_4_ + auVar41._4_4_ * fVar115 * auVar50._4_4_ * fVar113;
  auVar43._8_4_ = fVar205 * auVar45._8_4_ + auVar41._8_4_ * fVar115 * auVar50._8_4_ * fVar113;
  auVar43._12_4_ = fVar207 * auVar45._12_4_ + auVar41._12_4_ * fVar115 * auVar50._12_4_ * fVar113;
  auVar41 = vsubps_avx(auVar46,auVar43);
  _local_380 = vaddps_avx512vl(auVar42,auVar141);
  auVar54._0_4_ = auVar5._0_4_ * 0.33333334;
  auVar54._4_4_ = auVar5._4_4_ * 0.33333334;
  auVar54._8_4_ = auVar5._8_4_ * 0.33333334;
  auVar54._12_4_ = auVar5._12_4_ * 0.33333334;
  local_390 = vaddps_avx512vl(local_350,auVar54);
  auVar52._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar52._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar52._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar52._12_4_ = auVar41._12_4_ * 0.33333334;
  local_3a0 = vsubps_avx512vl(local_370,auVar52);
  auVar53._0_4_ = (fVar125 + auVar58._0_4_) * 0.33333334;
  auVar53._4_4_ = (fVar165 + auVar58._4_4_) * 0.33333334;
  auVar53._8_4_ = (fVar208 + auVar58._8_4_) * 0.33333334;
  auVar53._12_4_ = (fVar209 + auVar58._12_4_) * 0.33333334;
  _local_3b0 = vaddps_avx512vl(_local_360,auVar53);
  auVar106._0_4_ = (fVar210 + auVar43._0_4_) * 0.33333334;
  auVar106._4_4_ = (fVar104 + auVar43._4_4_) * 0.33333334;
  auVar106._8_4_ = (fVar204 + auVar43._8_4_) * 0.33333334;
  auVar106._12_4_ = (fVar206 + auVar43._12_4_) * 0.33333334;
  _local_3c0 = vsubps_avx512vl(_local_380,auVar106);
  local_2d0 = vsubps_avx(local_350,auVar51);
  uVar105 = local_2d0._0_4_;
  auVar63._4_4_ = uVar105;
  auVar63._0_4_ = uVar105;
  auVar63._8_4_ = uVar105;
  auVar63._12_4_ = uVar105;
  auVar41 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar45 = vshufps_avx(local_2d0,local_2d0,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar210 = pre->ray_space[k].vz.field_0.m128[0];
  fVar104 = pre->ray_space[k].vz.field_0.m128[1];
  fVar204 = pre->ray_space[k].vz.field_0.m128[2];
  fVar206 = pre->ray_space[k].vz.field_0.m128[3];
  auVar107._0_4_ = fVar210 * auVar45._0_4_;
  auVar107._4_4_ = fVar104 * auVar45._4_4_;
  auVar107._8_4_ = fVar204 * auVar45._8_4_;
  auVar107._12_4_ = fVar206 * auVar45._12_4_;
  auVar41 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar4,auVar41);
  auVar48 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar63);
  local_2e0 = vsubps_avx512vl(local_390,auVar51);
  uVar105 = local_2e0._0_4_;
  auVar61._4_4_ = uVar105;
  auVar61._0_4_ = uVar105;
  auVar61._8_4_ = uVar105;
  auVar61._12_4_ = uVar105;
  auVar41 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar45 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar66._0_4_ = fVar210 * auVar45._0_4_;
  auVar66._4_4_ = fVar104 * auVar45._4_4_;
  auVar66._8_4_ = fVar204 * auVar45._8_4_;
  auVar66._12_4_ = fVar206 * auVar45._12_4_;
  auVar41 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar41);
  auVar42 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar61);
  local_2f0 = vsubps_avx512vl(local_3a0,auVar51);
  uVar105 = local_2f0._0_4_;
  auVar59._4_4_ = uVar105;
  auVar59._0_4_ = uVar105;
  auVar59._8_4_ = uVar105;
  auVar59._12_4_ = uVar105;
  auVar41 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar45 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar167._0_4_ = auVar45._0_4_ * fVar210;
  auVar167._4_4_ = auVar45._4_4_ * fVar104;
  auVar167._8_4_ = auVar45._8_4_ * fVar204;
  auVar167._12_4_ = auVar45._12_4_ * fVar206;
  auVar41 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar4,auVar41);
  auVar46 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar59);
  local_300 = vsubps_avx512vl(local_370,auVar51);
  uVar105 = local_300._0_4_;
  auVar60._4_4_ = uVar105;
  auVar60._0_4_ = uVar105;
  auVar60._8_4_ = uVar105;
  auVar60._12_4_ = uVar105;
  auVar41 = vshufps_avx(local_300,local_300,0x55);
  auVar45 = vshufps_avx(local_300,local_300,0xaa);
  auVar174._0_4_ = auVar45._0_4_ * fVar210;
  auVar174._4_4_ = auVar45._4_4_ * fVar104;
  auVar174._8_4_ = auVar45._8_4_ * fVar204;
  auVar174._12_4_ = auVar45._12_4_ * fVar206;
  auVar41 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar4,auVar41);
  auVar49 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar60);
  local_310 = vsubps_avx(_local_360,auVar51);
  uVar105 = local_310._0_4_;
  auVar117._4_4_ = uVar105;
  auVar117._0_4_ = uVar105;
  auVar117._8_4_ = uVar105;
  auVar117._12_4_ = uVar105;
  auVar41 = vshufps_avx(local_310,local_310,0x55);
  auVar45 = vshufps_avx(local_310,local_310,0xaa);
  auVar187._0_4_ = auVar45._0_4_ * fVar210;
  auVar187._4_4_ = auVar45._4_4_ * fVar104;
  auVar187._8_4_ = auVar45._8_4_ * fVar204;
  auVar187._12_4_ = auVar45._12_4_ * fVar206;
  auVar41 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar4,auVar41);
  auVar43 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar117);
  local_320 = vsubps_avx512vl(_local_3b0,auVar51);
  uVar105 = local_320._0_4_;
  auVar55._4_4_ = uVar105;
  auVar55._0_4_ = uVar105;
  auVar55._8_4_ = uVar105;
  auVar55._12_4_ = uVar105;
  auVar41 = vshufps_avx(local_320,local_320,0x55);
  auVar45 = vshufps_avx(local_320,local_320,0xaa);
  auVar194._0_4_ = auVar45._0_4_ * fVar210;
  auVar194._4_4_ = auVar45._4_4_ * fVar104;
  auVar194._8_4_ = auVar45._8_4_ * fVar204;
  auVar194._12_4_ = auVar45._12_4_ * fVar206;
  auVar41 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar4,auVar41);
  auVar44 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar55);
  local_330 = vsubps_avx(_local_3c0,auVar51);
  uVar105 = local_330._0_4_;
  auVar56._4_4_ = uVar105;
  auVar56._0_4_ = uVar105;
  auVar56._8_4_ = uVar105;
  auVar56._12_4_ = uVar105;
  auVar41 = vshufps_avx(local_330,local_330,0x55);
  auVar45 = vshufps_avx(local_330,local_330,0xaa);
  auVar212._0_4_ = auVar45._0_4_ * fVar210;
  auVar212._4_4_ = auVar45._4_4_ * fVar104;
  auVar212._8_4_ = auVar45._8_4_ * fVar204;
  auVar212._12_4_ = auVar45._12_4_ * fVar206;
  auVar41 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar4,auVar41);
  auVar106 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar56);
  local_340 = vsubps_avx512vl(_local_380,auVar51);
  uVar105 = local_340._0_4_;
  auVar62._4_4_ = uVar105;
  auVar62._0_4_ = uVar105;
  auVar62._8_4_ = uVar105;
  auVar62._12_4_ = uVar105;
  auVar41 = vshufps_avx(local_340,local_340,0x55);
  auVar45 = vshufps_avx(local_340,local_340,0xaa);
  auVar142._0_4_ = fVar210 * auVar45._0_4_;
  auVar142._4_4_ = fVar104 * auVar45._4_4_;
  auVar142._8_4_ = fVar204 * auVar45._8_4_;
  auVar142._12_4_ = fVar206 * auVar45._12_4_;
  auVar41 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar4,auVar41);
  auVar107 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar3,auVar62);
  auVar5 = vmovlhps_avx(auVar48,auVar43);
  auVar50 = vmovlhps_avx(auVar42,auVar44);
  auVar47 = vmovlhps_avx512f(auVar46,auVar106);
  _local_2b0 = vmovlhps_avx512f(auVar49,auVar107);
  auVar45 = vminps_avx(auVar5,auVar50);
  auVar41 = vmaxps_avx(auVar5,auVar50);
  auVar51 = vminps_avx512vl(auVar47,_local_2b0);
  auVar45 = vminps_avx(auVar45,auVar51);
  auVar51 = vmaxps_avx512vl(auVar47,_local_2b0);
  auVar41 = vmaxps_avx(auVar41,auVar51);
  auVar51 = vshufpd_avx(auVar45,auVar45,3);
  auVar45 = vminps_avx(auVar45,auVar51);
  auVar51 = vshufpd_avx(auVar41,auVar41,3);
  auVar41 = vmaxps_avx(auVar41,auVar51);
  auVar45 = vandps_avx512vl(auVar45,auVar240._0_16_);
  auVar41 = vandps_avx512vl(auVar41,auVar240._0_16_);
  auVar41 = vmaxps_avx(auVar45,auVar41);
  auVar45 = vmovshdup_avx(auVar41);
  auVar41 = vmaxss_avx(auVar45,auVar41);
  auVar51 = vmovddup_avx512vl(auVar48);
  auVar48 = vmovddup_avx512vl(auVar42);
  auVar168._0_8_ = auVar46._0_8_;
  auVar168._8_8_ = auVar168._0_8_;
  auVar175._0_8_ = auVar49._0_8_;
  auVar175._8_8_ = auVar175._0_8_;
  local_2c0 = ZEXT416((uint)(auVar41._0_4_ * 9.536743e-07));
  local_260 = vbroadcastss_avx512vl(local_2c0);
  auVar41 = vxorps_avx512vl(local_260._0_16_,auVar241._0_16_);
  local_280 = vbroadcastss_avx512vl(auVar41);
  bVar12 = false;
  uVar31 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x60);
  auVar41 = vsubps_avx(auVar50,auVar5);
  local_290 = vsubps_avx512vl(auVar47,auVar50);
  local_2a0 = vsubps_avx512vl(_local_2b0,auVar47);
  local_3d0 = vsubps_avx(_local_360,local_350);
  local_3e0 = vsubps_avx512vl(_local_3b0,local_390);
  local_3f0 = vsubps_avx512vl(_local_3c0,local_3a0);
  _local_400 = vsubps_avx512vl(_local_380,local_370);
  local_200 = vpbroadcastd_avx512vl();
  auVar45 = ZEXT816(0x3f80000000000000);
  auVar49 = auVar45;
LAB_01a320b9:
  auVar42 = vshufps_avx(auVar49,auVar49,0x50);
  auVar226._8_4_ = 0x3f800000;
  auVar226._0_8_ = 0x3f8000003f800000;
  auVar226._12_4_ = 0x3f800000;
  auVar229._16_4_ = 0x3f800000;
  auVar229._0_16_ = auVar226;
  auVar229._20_4_ = 0x3f800000;
  auVar229._24_4_ = 0x3f800000;
  auVar229._28_4_ = 0x3f800000;
  auVar46 = vsubps_avx(auVar226,auVar42);
  fVar210 = auVar42._0_4_;
  fVar112 = auVar43._0_4_;
  auVar133._0_4_ = fVar112 * fVar210;
  fVar104 = auVar42._4_4_;
  fVar113 = auVar43._4_4_;
  auVar133._4_4_ = fVar113 * fVar104;
  fVar204 = auVar42._8_4_;
  auVar133._8_4_ = fVar112 * fVar204;
  fVar206 = auVar42._12_4_;
  auVar133._12_4_ = fVar113 * fVar206;
  fVar114 = auVar44._0_4_;
  auVar143._0_4_ = fVar114 * fVar210;
  fVar115 = auVar44._4_4_;
  auVar143._4_4_ = fVar115 * fVar104;
  auVar143._8_4_ = fVar114 * fVar204;
  auVar143._12_4_ = fVar115 * fVar206;
  fVar125 = auVar106._0_4_;
  auVar152._0_4_ = fVar125 * fVar210;
  fVar165 = auVar106._4_4_;
  auVar152._4_4_ = fVar165 * fVar104;
  auVar152._8_4_ = fVar125 * fVar204;
  auVar152._12_4_ = fVar165 * fVar206;
  fVar203 = auVar107._0_4_;
  auVar118._0_4_ = fVar203 * fVar210;
  fVar205 = auVar107._4_4_;
  auVar118._4_4_ = fVar205 * fVar104;
  auVar118._8_4_ = fVar203 * fVar204;
  auVar118._12_4_ = fVar205 * fVar206;
  auVar52 = vfmadd231ps_avx512vl(auVar133,auVar46,auVar51);
  auVar53 = vfmadd231ps_avx512vl(auVar143,auVar46,auVar48);
  auVar54 = vfmadd231ps_fma(auVar152,auVar46,auVar168);
  auVar46 = vfmadd231ps_fma(auVar118,auVar175,auVar46);
  auVar42 = vmovshdup_avx(auVar45);
  fVar104 = auVar45._0_4_;
  fVar210 = (auVar42._0_4_ - fVar104) * 0.04761905;
  auVar173._4_4_ = fVar104;
  auVar173._0_4_ = fVar104;
  auVar173._8_4_ = fVar104;
  auVar173._12_4_ = fVar104;
  auVar173._16_4_ = fVar104;
  auVar173._20_4_ = fVar104;
  auVar173._24_4_ = fVar104;
  auVar173._28_4_ = fVar104;
  auVar130._0_8_ = auVar42._0_8_;
  auVar130._8_8_ = auVar130._0_8_;
  auVar130._16_8_ = auVar130._0_8_;
  auVar130._24_8_ = auVar130._0_8_;
  auVar74 = vsubps_avx(auVar130,auVar173);
  uVar105 = auVar52._0_4_;
  auVar131._4_4_ = uVar105;
  auVar131._0_4_ = uVar105;
  auVar131._8_4_ = uVar105;
  auVar131._12_4_ = uVar105;
  auVar131._16_4_ = uVar105;
  auVar131._20_4_ = uVar105;
  auVar131._24_4_ = uVar105;
  auVar131._28_4_ = uVar105;
  auVar190._8_4_ = 1;
  auVar190._0_8_ = 0x100000001;
  auVar190._12_4_ = 1;
  auVar190._16_4_ = 1;
  auVar190._20_4_ = 1;
  auVar190._24_4_ = 1;
  auVar190._28_4_ = 1;
  auVar87 = ZEXT1632(auVar52);
  auVar71 = vpermps_avx2(auVar190,auVar87);
  auVar72 = vbroadcastss_avx512vl(auVar53);
  auVar88 = ZEXT1632(auVar53);
  auVar73 = vpermps_avx512vl(auVar190,auVar88);
  auVar79 = vbroadcastss_avx512vl(auVar54);
  auVar68 = ZEXT1632(auVar54);
  auVar80 = vpermps_avx512vl(auVar190,auVar68);
  auVar81 = vbroadcastss_avx512vl(auVar46);
  auVar84 = ZEXT1632(auVar46);
  auVar82 = vpermps_avx512vl(auVar190,auVar84);
  auVar191._4_4_ = fVar210;
  auVar191._0_4_ = fVar210;
  auVar191._8_4_ = fVar210;
  auVar191._12_4_ = fVar210;
  auVar191._16_4_ = fVar210;
  auVar191._20_4_ = fVar210;
  auVar191._24_4_ = fVar210;
  auVar191._28_4_ = fVar210;
  auVar85 = auVar245._0_32_;
  auVar69 = vpermps_avx512vl(auVar85,auVar87);
  auVar164._8_4_ = 3;
  auVar164._0_8_ = 0x300000003;
  auVar164._12_4_ = 3;
  auVar164._16_4_ = 3;
  auVar164._20_4_ = 3;
  auVar164._24_4_ = 3;
  auVar164._28_4_ = 3;
  auVar70 = vpermps_avx512vl(auVar164,auVar87);
  auVar83 = vpermps_avx512vl(auVar85,auVar88);
  auVar87 = vpermps_avx2(auVar164,auVar88);
  auVar67 = vpermps_avx512vl(auVar85,auVar68);
  auVar88 = vpermps_avx2(auVar164,auVar68);
  auVar68 = vpermps_avx512vl(auVar85,auVar84);
  auVar84 = vpermps_avx512vl(auVar164,auVar84);
  auVar42 = vfmadd132ps_fma(auVar74,auVar173,_DAT_01f7b040);
  auVar74 = vsubps_avx(auVar229,ZEXT1632(auVar42));
  auVar85 = vmulps_avx512vl(auVar72,ZEXT1632(auVar42));
  auVar89 = ZEXT1632(auVar42);
  auVar86 = vmulps_avx512vl(auVar73,auVar89);
  auVar46 = vfmadd231ps_fma(auVar85,auVar74,auVar131);
  auVar54 = vfmadd231ps_fma(auVar86,auVar74,auVar71);
  auVar85 = vmulps_avx512vl(auVar79,auVar89);
  auVar86 = vmulps_avx512vl(auVar80,auVar89);
  auVar72 = vfmadd231ps_avx512vl(auVar85,auVar74,auVar72);
  auVar73 = vfmadd231ps_avx512vl(auVar86,auVar74,auVar73);
  auVar85 = vmulps_avx512vl(auVar81,auVar89);
  auVar86 = ZEXT1632(auVar42);
  auVar82 = vmulps_avx512vl(auVar82,auVar86);
  auVar79 = vfmadd231ps_avx512vl(auVar85,auVar74,auVar79);
  auVar80 = vfmadd231ps_avx512vl(auVar82,auVar74,auVar80);
  fVar204 = auVar42._0_4_;
  fVar206 = auVar42._4_4_;
  auVar23._4_4_ = fVar206 * auVar72._4_4_;
  auVar23._0_4_ = fVar204 * auVar72._0_4_;
  fVar208 = auVar42._8_4_;
  auVar23._8_4_ = fVar208 * auVar72._8_4_;
  fVar209 = auVar42._12_4_;
  auVar23._12_4_ = fVar209 * auVar72._12_4_;
  auVar23._16_4_ = auVar72._16_4_ * 0.0;
  auVar23._20_4_ = auVar72._20_4_ * 0.0;
  auVar23._24_4_ = auVar72._24_4_ * 0.0;
  auVar23._28_4_ = fVar104;
  auVar24._4_4_ = fVar206 * auVar73._4_4_;
  auVar24._0_4_ = fVar204 * auVar73._0_4_;
  auVar24._8_4_ = fVar208 * auVar73._8_4_;
  auVar24._12_4_ = fVar209 * auVar73._12_4_;
  auVar24._16_4_ = auVar73._16_4_ * 0.0;
  auVar24._20_4_ = auVar73._20_4_ * 0.0;
  auVar24._24_4_ = auVar73._24_4_ * 0.0;
  auVar24._28_4_ = auVar71._28_4_;
  auVar46 = vfmadd231ps_fma(auVar23,auVar74,ZEXT1632(auVar46));
  auVar54 = vfmadd231ps_fma(auVar24,auVar74,ZEXT1632(auVar54));
  auVar123._0_4_ = fVar204 * auVar79._0_4_;
  auVar123._4_4_ = fVar206 * auVar79._4_4_;
  auVar123._8_4_ = fVar208 * auVar79._8_4_;
  auVar123._12_4_ = fVar209 * auVar79._12_4_;
  auVar123._16_4_ = auVar79._16_4_ * 0.0;
  auVar123._20_4_ = auVar79._20_4_ * 0.0;
  auVar123._24_4_ = auVar79._24_4_ * 0.0;
  auVar123._28_4_ = 0;
  auVar25._4_4_ = fVar206 * auVar80._4_4_;
  auVar25._0_4_ = fVar204 * auVar80._0_4_;
  auVar25._8_4_ = fVar208 * auVar80._8_4_;
  auVar25._12_4_ = fVar209 * auVar80._12_4_;
  auVar25._16_4_ = auVar80._16_4_ * 0.0;
  auVar25._20_4_ = auVar80._20_4_ * 0.0;
  auVar25._24_4_ = auVar80._24_4_ * 0.0;
  auVar25._28_4_ = auVar79._28_4_;
  auVar52 = vfmadd231ps_fma(auVar123,auVar74,auVar72);
  auVar53 = vfmadd231ps_fma(auVar25,auVar74,auVar73);
  auVar26._28_4_ = auVar73._28_4_;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(fVar209 * auVar53._12_4_,
                          CONCAT48(fVar208 * auVar53._8_4_,
                                   CONCAT44(fVar206 * auVar53._4_4_,fVar204 * auVar53._0_4_))));
  auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar209 * auVar52._12_4_,
                                               CONCAT48(fVar208 * auVar52._8_4_,
                                                        CONCAT44(fVar206 * auVar52._4_4_,
                                                                 fVar204 * auVar52._0_4_)))),auVar74
                            ,ZEXT1632(auVar46));
  auVar66 = vfmadd231ps_fma(auVar26,auVar74,ZEXT1632(auVar54));
  auVar71 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar46));
  auVar72 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar54));
  auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar71 = vmulps_avx512vl(auVar71,auVar73);
  auVar72 = vmulps_avx512vl(auVar72,auVar73);
  auVar184._0_4_ = fVar210 * auVar71._0_4_;
  auVar184._4_4_ = fVar210 * auVar71._4_4_;
  auVar184._8_4_ = fVar210 * auVar71._8_4_;
  auVar184._12_4_ = fVar210 * auVar71._12_4_;
  auVar184._16_4_ = fVar210 * auVar71._16_4_;
  auVar184._20_4_ = fVar210 * auVar71._20_4_;
  auVar184._24_4_ = fVar210 * auVar71._24_4_;
  auVar184._28_4_ = 0;
  auVar71 = vmulps_avx512vl(auVar191,auVar72);
  auVar54 = vxorps_avx512vl(auVar81._0_16_,auVar81._0_16_);
  auVar72 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01fb9fc0,ZEXT1632(auVar54));
  auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar66),_DAT_01fb9fc0,ZEXT1632(auVar54));
  auVar124._0_4_ = auVar184._0_4_ + auVar63._0_4_;
  auVar124._4_4_ = auVar184._4_4_ + auVar63._4_4_;
  auVar124._8_4_ = auVar184._8_4_ + auVar63._8_4_;
  auVar124._12_4_ = auVar184._12_4_ + auVar63._12_4_;
  auVar124._16_4_ = auVar184._16_4_ + 0.0;
  auVar124._20_4_ = auVar184._20_4_ + 0.0;
  auVar124._24_4_ = auVar184._24_4_ + 0.0;
  auVar124._28_4_ = 0;
  auVar89 = ZEXT1632(auVar54);
  auVar80 = vpermt2ps_avx512vl(auVar184,_DAT_01fb9fc0,auVar89);
  auVar81 = vaddps_avx512vl(ZEXT1632(auVar66),auVar71);
  auVar82 = vpermt2ps_avx512vl(auVar71,_DAT_01fb9fc0,auVar89);
  auVar71 = vsubps_avx(auVar72,auVar80);
  auVar80 = vsubps_avx512vl(auVar79,auVar82);
  auVar82 = vmulps_avx512vl(auVar83,auVar86);
  auVar85 = vmulps_avx512vl(auVar87,auVar86);
  auVar82 = vfmadd231ps_avx512vl(auVar82,auVar74,auVar69);
  auVar69 = vfmadd231ps_avx512vl(auVar85,auVar74,auVar70);
  auVar70 = vmulps_avx512vl(auVar67,auVar86);
  auVar85 = vmulps_avx512vl(auVar88,auVar86);
  auVar70 = vfmadd231ps_avx512vl(auVar70,auVar74,auVar83);
  auVar87 = vfmadd231ps_avx512vl(auVar85,auVar74,auVar87);
  auVar83 = vmulps_avx512vl(auVar68,auVar86);
  auVar68 = vmulps_avx512vl(auVar84,auVar86);
  auVar46 = vfmadd231ps_fma(auVar83,auVar74,auVar67);
  auVar83 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar88);
  auVar67 = vmulps_avx512vl(auVar86,auVar70);
  auVar84 = ZEXT1632(auVar42);
  auVar68 = vmulps_avx512vl(auVar84,auVar87);
  auVar82 = vfmadd231ps_avx512vl(auVar67,auVar74,auVar82);
  auVar69 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar69);
  auVar83 = vmulps_avx512vl(auVar84,auVar83);
  auVar70 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar209 * auVar46._12_4_,
                                          CONCAT48(fVar208 * auVar46._8_4_,
                                                   CONCAT44(fVar206 * auVar46._4_4_,
                                                            fVar204 * auVar46._0_4_)))),auVar74,
                       auVar70);
  auVar87 = vfmadd231ps_avx512vl(auVar83,auVar74,auVar87);
  auVar27._4_4_ = fVar206 * auVar70._4_4_;
  auVar27._0_4_ = fVar204 * auVar70._0_4_;
  auVar27._8_4_ = fVar208 * auVar70._8_4_;
  auVar27._12_4_ = fVar209 * auVar70._12_4_;
  auVar27._16_4_ = auVar70._16_4_ * 0.0;
  auVar27._20_4_ = auVar70._20_4_ * 0.0;
  auVar27._24_4_ = auVar70._24_4_ * 0.0;
  auVar27._28_4_ = auVar88._28_4_;
  auVar88 = vmulps_avx512vl(auVar84,auVar87);
  auVar83 = vfmadd231ps_avx512vl(auVar27,auVar74,auVar82);
  auVar88 = vfmadd231ps_avx512vl(auVar88,auVar69,auVar74);
  auVar74 = vsubps_avx512vl(auVar70,auVar82);
  auVar87 = vsubps_avx512vl(auVar87,auVar69);
  auVar74 = vmulps_avx512vl(auVar74,auVar73);
  auVar87 = vmulps_avx512vl(auVar87,auVar73);
  fVar104 = fVar210 * auVar74._0_4_;
  fVar204 = fVar210 * auVar74._4_4_;
  auVar28._4_4_ = fVar204;
  auVar28._0_4_ = fVar104;
  fVar206 = fVar210 * auVar74._8_4_;
  auVar28._8_4_ = fVar206;
  fVar208 = fVar210 * auVar74._12_4_;
  auVar28._12_4_ = fVar208;
  fVar209 = fVar210 * auVar74._16_4_;
  auVar28._16_4_ = fVar209;
  fVar193 = fVar210 * auVar74._20_4_;
  auVar28._20_4_ = fVar193;
  fVar210 = fVar210 * auVar74._24_4_;
  auVar28._24_4_ = fVar210;
  auVar28._28_4_ = auVar74._28_4_;
  auVar87 = vmulps_avx512vl(auVar191,auVar87);
  auVar73 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,auVar89);
  auVar82 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,auVar89);
  auVar192._0_4_ = auVar83._0_4_ + fVar104;
  auVar192._4_4_ = auVar83._4_4_ + fVar204;
  auVar192._8_4_ = auVar83._8_4_ + fVar206;
  auVar192._12_4_ = auVar83._12_4_ + fVar208;
  auVar192._16_4_ = auVar83._16_4_ + fVar209;
  auVar192._20_4_ = auVar83._20_4_ + fVar193;
  auVar192._24_4_ = auVar83._24_4_ + fVar210;
  auVar192._28_4_ = auVar83._28_4_ + auVar74._28_4_;
  auVar74 = vpermt2ps_avx512vl(auVar28,_DAT_01fb9fc0,ZEXT1632(auVar54));
  auVar69 = vaddps_avx512vl(auVar88,auVar87);
  auVar237 = ZEXT3264(auVar69);
  auVar87 = vpermt2ps_avx512vl(auVar87,_DAT_01fb9fc0,ZEXT1632(auVar54));
  auVar74 = vsubps_avx(auVar73,auVar74);
  auVar87 = vsubps_avx512vl(auVar82,auVar87);
  auVar136 = ZEXT1632(auVar63);
  auVar70 = vsubps_avx512vl(auVar83,auVar136);
  auVar149 = ZEXT1632(auVar66);
  auVar67 = vsubps_avx512vl(auVar88,auVar149);
  auVar68 = vsubps_avx512vl(auVar73,auVar72);
  auVar70 = vaddps_avx512vl(auVar70,auVar68);
  auVar68 = vsubps_avx512vl(auVar82,auVar79);
  auVar67 = vaddps_avx512vl(auVar67,auVar68);
  auVar68 = vmulps_avx512vl(auVar149,auVar70);
  auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar136,auVar67);
  auVar84 = vmulps_avx512vl(auVar81,auVar70);
  auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar124,auVar67);
  auVar85 = vmulps_avx512vl(auVar80,auVar70);
  auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar71,auVar67);
  auVar86 = vmulps_avx512vl(auVar79,auVar70);
  auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar72,auVar67);
  auVar89 = vmulps_avx512vl(auVar88,auVar70);
  auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar83,auVar67);
  auVar90 = vmulps_avx512vl(auVar69,auVar70);
  auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar192,auVar67);
  auVar91 = vmulps_avx512vl(auVar87,auVar70);
  auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar74,auVar67);
  auVar70 = vmulps_avx512vl(auVar82,auVar70);
  auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar73,auVar67);
  auVar67 = vminps_avx512vl(auVar68,auVar84);
  auVar68 = vmaxps_avx512vl(auVar68,auVar84);
  auVar84 = vminps_avx512vl(auVar85,auVar86);
  auVar67 = vminps_avx512vl(auVar67,auVar84);
  auVar84 = vmaxps_avx512vl(auVar85,auVar86);
  auVar68 = vmaxps_avx512vl(auVar68,auVar84);
  auVar84 = vminps_avx512vl(auVar89,auVar90);
  auVar85 = vmaxps_avx512vl(auVar89,auVar90);
  auVar86 = vminps_avx512vl(auVar91,auVar70);
  auVar84 = vminps_avx512vl(auVar84,auVar86);
  auVar67 = vminps_avx512vl(auVar67,auVar84);
  auVar70 = vmaxps_avx512vl(auVar91,auVar70);
  auVar70 = vmaxps_avx512vl(auVar85,auVar70);
  auVar70 = vmaxps_avx512vl(auVar68,auVar70);
  uVar17 = vcmpps_avx512vl(auVar67,local_260,2);
  uVar18 = vcmpps_avx512vl(auVar70,local_280,5);
  bVar29 = (byte)uVar17 & (byte)uVar18 & 0x7f;
  if (bVar29 != 0) {
    auVar70 = vsubps_avx512vl(auVar72,auVar136);
    auVar67 = vsubps_avx512vl(auVar79,auVar149);
    auVar68 = vsubps_avx512vl(auVar73,auVar83);
    auVar70 = vaddps_avx512vl(auVar70,auVar68);
    auVar68 = vsubps_avx512vl(auVar82,auVar88);
    auVar67 = vaddps_avx512vl(auVar67,auVar68);
    auVar68 = vmulps_avx512vl(auVar149,auVar70);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar67,auVar136);
    auVar81 = vmulps_avx512vl(auVar81,auVar70);
    auVar81 = vfnmadd213ps_avx512vl(auVar124,auVar67,auVar81);
    auVar80 = vmulps_avx512vl(auVar80,auVar70);
    auVar80 = vfnmadd213ps_avx512vl(auVar71,auVar67,auVar80);
    auVar71 = vmulps_avx512vl(auVar79,auVar70);
    auVar79 = vfnmadd231ps_avx512vl(auVar71,auVar67,auVar72);
    auVar71 = vmulps_avx512vl(auVar88,auVar70);
    auVar88 = vfnmadd231ps_avx512vl(auVar71,auVar67,auVar83);
    auVar71 = vmulps_avx512vl(auVar69,auVar70);
    auVar69 = vfnmadd213ps_avx512vl(auVar192,auVar67,auVar71);
    auVar71 = vmulps_avx512vl(auVar87,auVar70);
    auVar83 = vfnmadd213ps_avx512vl(auVar74,auVar67,auVar71);
    auVar74 = vmulps_avx512vl(auVar82,auVar70);
    auVar73 = vfnmadd231ps_avx512vl(auVar74,auVar73,auVar67);
    auVar71 = vminps_avx(auVar68,auVar81);
    auVar74 = vmaxps_avx(auVar68,auVar81);
    auVar72 = vminps_avx(auVar80,auVar79);
    auVar72 = vminps_avx(auVar71,auVar72);
    auVar71 = vmaxps_avx(auVar80,auVar79);
    auVar74 = vmaxps_avx(auVar74,auVar71);
    auVar87 = vminps_avx(auVar88,auVar69);
    auVar71 = vmaxps_avx(auVar88,auVar69);
    auVar88 = vminps_avx(auVar83,auVar73);
    auVar87 = vminps_avx(auVar87,auVar88);
    auVar87 = vminps_avx(auVar72,auVar87);
    auVar72 = vmaxps_avx(auVar83,auVar73);
    auVar71 = vmaxps_avx(auVar71,auVar72);
    auVar74 = vmaxps_avx(auVar74,auVar71);
    uVar17 = vcmpps_avx512vl(auVar74,local_280,5);
    uVar18 = vcmpps_avx512vl(auVar87,local_260,2);
    bVar29 = bVar29 & (byte)uVar17 & (byte)uVar18;
    if (bVar29 != 0) {
      auStack_460[uVar31] = (uint)bVar29;
      uVar17 = vmovlps_avx(auVar45);
      (&uStack_240)[uVar31] = uVar17;
      uVar2 = vmovlps_avx(auVar49);
      auStack_1a0[uVar31] = uVar2;
      uVar31 = (ulong)((int)uVar31 + 1);
    }
  }
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar238 = ZEXT1664(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar240 = ZEXT1664(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar241 = ZEXT1664(auVar45);
  auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar239 = ZEXT3264(auVar74);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar242 = ZEXT1664(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar243 = ZEXT1664(auVar45);
  auVar244 = ZEXT3264(_DAT_01fb9fe0);
LAB_01a325b4:
  do {
    do {
      do {
        if ((int)uVar31 == 0) {
          if (bVar12) goto LAB_01a334e2;
          uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar22._4_4_ = uVar105;
          auVar22._0_4_ = uVar105;
          auVar22._8_4_ = uVar105;
          auVar22._12_4_ = uVar105;
          auVar22._16_4_ = uVar105;
          auVar22._20_4_ = uVar105;
          auVar22._24_4_ = uVar105;
          auVar22._28_4_ = uVar105;
          uVar17 = vcmpps_avx512vl(local_1c0,auVar22,2);
          uVar36 = (ulong)((uint)uVar36 & (uint)uVar36 + 0xff & (uint)uVar17);
          goto LAB_01a319ae;
        }
        uVar30 = (int)uVar31 - 1;
        uVar32 = (ulong)uVar30;
        uVar7 = auStack_460[uVar32];
        auVar49._8_8_ = 0;
        auVar49._0_8_ = auStack_1a0[uVar32];
        uVar2 = 0;
        for (uVar35 = (ulong)uVar7; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
          uVar2 = uVar2 + 1;
        }
        uVar34 = uVar7 - 1 & uVar7;
        bVar39 = uVar34 == 0;
        auStack_460[uVar32] = uVar34;
        if (bVar39) {
          uVar31 = (ulong)uVar30;
        }
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar2;
        auVar45 = vpunpcklqdq_avx(auVar108,ZEXT416((int)uVar2 + 1));
        auVar45 = vcvtqq2ps_avx512vl(auVar45);
        auVar45 = vmulps_avx512vl(auVar45,auVar242._0_16_);
        uVar105 = *(undefined4 *)((long)&uStack_240 + uVar32 * 8 + 4);
        auVar19._4_4_ = uVar105;
        auVar19._0_4_ = uVar105;
        auVar19._8_4_ = uVar105;
        auVar19._12_4_ = uVar105;
        auVar42 = vmulps_avx512vl(auVar45,auVar19);
        auVar46 = auVar243._0_16_;
        auVar45 = vsubps_avx512vl(auVar46,auVar45);
        uVar105 = *(undefined4 *)(&uStack_240 + uVar32);
        auVar20._4_4_ = uVar105;
        auVar20._0_4_ = uVar105;
        auVar20._8_4_ = uVar105;
        auVar20._12_4_ = uVar105;
        auVar45 = vfmadd231ps_avx512vl(auVar42,auVar45,auVar20);
        auVar42 = vmovshdup_avx(auVar45);
        fVar210 = auVar42._0_4_ - auVar45._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar210));
        if (uVar7 == 0 || bVar39) goto LAB_01a320b9;
        auVar42 = vshufps_avx(auVar49,auVar49,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar210));
        auVar53 = vsubps_avx512vl(auVar46,auVar42);
        fVar104 = auVar42._0_4_;
        auVar144._0_4_ = fVar104 * fVar112;
        fVar204 = auVar42._4_4_;
        auVar144._4_4_ = fVar204 * fVar113;
        fVar206 = auVar42._8_4_;
        auVar144._8_4_ = fVar206 * fVar112;
        fVar208 = auVar42._12_4_;
        auVar144._12_4_ = fVar208 * fVar113;
        auVar153._0_4_ = fVar104 * fVar114;
        auVar153._4_4_ = fVar204 * fVar115;
        auVar153._8_4_ = fVar206 * fVar114;
        auVar153._12_4_ = fVar208 * fVar115;
        auVar158._0_4_ = fVar104 * fVar125;
        auVar158._4_4_ = fVar204 * fVar165;
        auVar158._8_4_ = fVar206 * fVar125;
        auVar158._12_4_ = fVar208 * fVar165;
        auVar126._0_4_ = fVar104 * fVar203;
        auVar126._4_4_ = fVar204 * fVar205;
        auVar126._8_4_ = fVar206 * fVar203;
        auVar126._12_4_ = fVar208 * fVar205;
        auVar42 = vfmadd231ps_fma(auVar144,auVar53,auVar51);
        auVar54 = vfmadd231ps_fma(auVar153,auVar53,auVar48);
        auVar52 = vfmadd231ps_fma(auVar158,auVar53,auVar168);
        auVar53 = vfmadd231ps_fma(auVar126,auVar53,auVar175);
        auVar137._16_16_ = auVar42;
        auVar137._0_16_ = auVar42;
        auVar150._16_16_ = auVar54;
        auVar150._0_16_ = auVar54;
        auVar157._16_16_ = auVar52;
        auVar157._0_16_ = auVar52;
        auVar71 = vpermps_avx512vl(auVar244._0_32_,ZEXT1632(auVar45));
        auVar74 = vsubps_avx(auVar150,auVar137);
        auVar54 = vfmadd213ps_fma(auVar74,auVar71,auVar137);
        auVar74 = vsubps_avx(auVar157,auVar150);
        auVar63 = vfmadd213ps_fma(auVar74,auVar71,auVar150);
        auVar42 = vsubps_avx(auVar53,auVar52);
        auVar151._16_16_ = auVar42;
        auVar151._0_16_ = auVar42;
        auVar42 = vfmadd213ps_fma(auVar151,auVar71,auVar157);
        auVar74 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar54));
        auVar54 = vfmadd213ps_fma(auVar74,auVar71,ZEXT1632(auVar54));
        auVar74 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar63));
        auVar42 = vfmadd213ps_fma(auVar74,auVar71,ZEXT1632(auVar63));
        auVar74 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar54));
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar74,auVar71);
        auVar74 = vmulps_avx512vl(auVar74,auVar239._0_32_);
        auVar93._16_16_ = auVar74._16_16_;
        fVar104 = fVar210 * 0.33333334;
        auVar159._0_8_ =
             CONCAT44(auVar117._4_4_ + fVar104 * auVar74._4_4_,
                      auVar117._0_4_ + fVar104 * auVar74._0_4_);
        auVar159._8_4_ = auVar117._8_4_ + fVar104 * auVar74._8_4_;
        auVar159._12_4_ = auVar117._12_4_ + fVar104 * auVar74._12_4_;
        auVar145._0_4_ = fVar104 * auVar74._16_4_;
        auVar145._4_4_ = fVar104 * auVar74._20_4_;
        auVar145._8_4_ = fVar104 * auVar74._24_4_;
        auVar145._12_4_ = fVar104 * auVar74._28_4_;
        auVar61 = vsubps_avx((undefined1  [16])0x0,auVar145);
        auVar63 = vshufpd_avx(auVar117,auVar117,3);
        auVar66 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar42 = vsubps_avx(auVar63,auVar117);
        auVar54 = vsubps_avx(auVar66,(undefined1  [16])0x0);
        auVar176._0_4_ = auVar42._0_4_ + auVar54._0_4_;
        auVar176._4_4_ = auVar42._4_4_ + auVar54._4_4_;
        auVar176._8_4_ = auVar42._8_4_ + auVar54._8_4_;
        auVar176._12_4_ = auVar42._12_4_ + auVar54._12_4_;
        auVar42 = vshufps_avx(auVar117,auVar117,0xb1);
        auVar54 = vshufps_avx(auVar159,auVar159,0xb1);
        auVar52 = vshufps_avx(auVar61,auVar61,0xb1);
        auVar53 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar227._4_4_ = auVar176._0_4_;
        auVar227._0_4_ = auVar176._0_4_;
        auVar227._8_4_ = auVar176._0_4_;
        auVar227._12_4_ = auVar176._0_4_;
        auVar57 = vshufps_avx(auVar176,auVar176,0x55);
        fVar104 = auVar57._0_4_;
        auVar188._0_4_ = auVar42._0_4_ * fVar104;
        fVar204 = auVar57._4_4_;
        auVar188._4_4_ = auVar42._4_4_ * fVar204;
        fVar206 = auVar57._8_4_;
        auVar188._8_4_ = auVar42._8_4_ * fVar206;
        fVar208 = auVar57._12_4_;
        auVar188._12_4_ = auVar42._12_4_ * fVar208;
        auVar195._0_4_ = auVar54._0_4_ * fVar104;
        auVar195._4_4_ = auVar54._4_4_ * fVar204;
        auVar195._8_4_ = auVar54._8_4_ * fVar206;
        auVar195._12_4_ = auVar54._12_4_ * fVar208;
        auVar213._0_4_ = auVar52._0_4_ * fVar104;
        auVar213._4_4_ = auVar52._4_4_ * fVar204;
        auVar213._8_4_ = auVar52._8_4_ * fVar206;
        auVar213._12_4_ = auVar52._12_4_ * fVar208;
        auVar177._0_4_ = auVar53._0_4_ * fVar104;
        auVar177._4_4_ = auVar53._4_4_ * fVar204;
        auVar177._8_4_ = auVar53._8_4_ * fVar206;
        auVar177._12_4_ = auVar53._12_4_ * fVar208;
        auVar42 = vfmadd231ps_fma(auVar188,auVar227,auVar117);
        auVar54 = vfmadd231ps_fma(auVar195,auVar227,auVar159);
        auVar59 = vfmadd231ps_fma(auVar213,auVar227,auVar61);
        auVar60 = vfmadd231ps_fma(auVar177,(undefined1  [16])0x0,auVar227);
        auVar57 = vshufpd_avx(auVar42,auVar42,1);
        auVar58 = vshufpd_avx(auVar54,auVar54,1);
        auVar55 = vshufpd_avx512vl(auVar59,auVar59,1);
        auVar56 = vshufpd_avx512vl(auVar60,auVar60,1);
        auVar52 = vminss_avx(auVar42,auVar54);
        auVar42 = vmaxss_avx(auVar54,auVar42);
        auVar53 = vminss_avx(auVar59,auVar60);
        auVar54 = vmaxss_avx(auVar60,auVar59);
        auVar52 = vminss_avx(auVar52,auVar53);
        auVar42 = vmaxss_avx(auVar54,auVar42);
        auVar53 = vminss_avx(auVar57,auVar58);
        auVar54 = vmaxss_avx(auVar58,auVar57);
        auVar57 = vminss_avx512f(auVar55,auVar56);
        auVar58 = vmaxss_avx512f(auVar56,auVar55);
        auVar54 = vmaxss_avx(auVar58,auVar54);
        auVar53 = vminss_avx512f(auVar53,auVar57);
        auVar237 = ZEXT1664(auVar53);
        fVar204 = auVar54._0_4_;
        fVar104 = auVar42._0_4_;
        if (auVar52._0_4_ < 0.0001) {
          bVar40 = fVar204 == -0.0001;
          bVar37 = NAN(fVar204);
          if (fVar204 <= -0.0001) goto LAB_01a327de;
          break;
        }
LAB_01a327de:
        vucomiss_avx512f(auVar53);
        bVar40 = fVar204 <= -0.0001;
        bVar38 = -0.0001 < fVar104;
        bVar37 = bVar40;
        if (!bVar40) break;
        uVar17 = vcmpps_avx512vl(auVar52,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar18 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar29 = (byte)uVar17 & (byte)uVar18;
        bVar13 = (bVar29 & 1) == 0;
        bVar40 = bVar38 && bVar13;
        bVar37 = bVar38 && (bVar29 & 1) == 0;
      } while (!bVar38 || !bVar13);
      auVar59 = auVar246._0_16_;
      vcmpss_avx512f(auVar52,auVar59,1);
      uVar17 = vcmpss_avx512f(auVar42,auVar59,1);
      bVar38 = (bool)((byte)uVar17 & 1);
      auVar93._0_16_ = auVar247._0_16_;
      auVar92._4_28_ = auVar93._4_28_;
      auVar92._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * auVar247._0_4_);
      vucomiss_avx512f(auVar92._0_16_);
      bVar37 = (bool)(!bVar40 | bVar37);
      bVar38 = bVar37 == false;
      auVar95._16_16_ = auVar93._16_16_;
      auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar94._4_28_ = auVar95._4_28_;
      auVar94._0_4_ = (uint)bVar37 * auVar246._0_4_ + (uint)!bVar37 * 0x7f800000;
      auVar58 = auVar94._0_16_;
      auVar97._16_16_ = auVar93._16_16_;
      auVar97._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar96._4_28_ = auVar97._4_28_;
      auVar96._0_4_ = (uint)bVar37 * auVar246._0_4_ + (uint)!bVar37 * -0x800000;
      auVar57 = auVar96._0_16_;
      uVar17 = vcmpss_avx512f(auVar53,auVar59,1);
      bVar40 = (bool)((byte)uVar17 & 1);
      auVar99._16_16_ = auVar93._16_16_;
      auVar99._0_16_ = auVar247._0_16_;
      auVar98._4_28_ = auVar99._4_28_;
      auVar98._0_4_ = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * auVar247._0_4_);
      vucomiss_avx512f(auVar98._0_16_);
      if ((bVar37) || (bVar38)) {
        auVar53 = vucomiss_avx512f(auVar52);
        if ((bVar37) || (bVar38)) {
          auVar60 = vxorps_avx512vl(auVar52,auVar241._0_16_);
          auVar52 = vsubss_avx512f(auVar53,auVar52);
          auVar52 = vdivss_avx512f(auVar60,auVar52);
          auVar53 = vsubss_avx512f(ZEXT416(0x3f800000),auVar52);
          auVar52 = vfmadd213ss_avx512f(auVar53,auVar59,auVar52);
          auVar237 = ZEXT1664(auVar52);
        }
        else {
          auVar52 = vxorps_avx512vl(auVar53,auVar53);
          auVar237 = ZEXT1664(auVar52);
          vucomiss_avx512f(auVar52);
          auVar52 = ZEXT416(0x3f800000);
          if ((bVar37) || (bVar38)) {
            auVar237 = ZEXT464(0x7f800000);
            auVar52 = SUB6416(ZEXT464(0xff800000),0);
          }
        }
        auVar58 = vminss_avx512f(auVar58,auVar237._0_16_);
        auVar57 = vmaxss_avx(auVar52,auVar57);
      }
      auVar247 = ZEXT464(0x3f800000);
      uVar17 = vcmpss_avx512f(auVar54,auVar59,1);
      bVar40 = (bool)((byte)uVar17 & 1);
      auVar54 = auVar247._0_16_;
      fVar206 = (float)((uint)bVar40 * -0x40800000 + (uint)!bVar40 * 0x3f800000);
      if ((auVar92._0_4_ != fVar206) || (NAN(auVar92._0_4_) || NAN(fVar206))) {
        if ((fVar204 != fVar104) || (NAN(fVar204) || NAN(fVar104))) {
          auVar42 = vxorps_avx512vl(auVar42,auVar241._0_16_);
          auVar178._0_4_ = auVar42._0_4_ / (fVar204 - fVar104);
          auVar178._4_12_ = auVar42._4_12_;
          auVar42 = vsubss_avx512f(auVar54,auVar178);
          auVar42 = vfmadd213ss_avx512f(auVar42,auVar59,auVar178);
          auVar52 = auVar42;
        }
        else if ((fVar104 != 0.0) ||
                (auVar42 = auVar54, auVar52 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar104))) {
          auVar42 = SUB6416(ZEXT464(0xff800000),0);
          auVar52 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar58 = vminss_avx(auVar58,auVar52);
        auVar57 = vmaxss_avx(auVar42,auVar57);
      }
      bVar40 = auVar98._0_4_ != fVar206;
      auVar42 = vminss_avx512f(auVar58,auVar54);
      auVar101._16_16_ = auVar93._16_16_;
      auVar101._0_16_ = auVar58;
      auVar100._4_28_ = auVar101._4_28_;
      auVar100._0_4_ = (uint)bVar40 * auVar42._0_4_ + (uint)!bVar40 * auVar58._0_4_;
      auVar42 = vmaxss_avx512f(auVar54,auVar57);
      auVar103._16_16_ = auVar93._16_16_;
      auVar103._0_16_ = auVar57;
      auVar102._4_28_ = auVar103._4_28_;
      auVar102._0_4_ = (uint)bVar40 * auVar42._0_4_ + (uint)!bVar40 * auVar57._0_4_;
      auVar42 = vmaxss_avx512f(auVar59,auVar100._0_16_);
      auVar52 = vminss_avx512f(auVar102._0_16_,auVar54);
    } while (auVar52._0_4_ < auVar42._0_4_);
    auVar59 = vmaxss_avx512f(auVar59,ZEXT416((uint)(auVar42._0_4_ + -0.1)));
    auVar60 = vminss_avx512f(ZEXT416((uint)(auVar52._0_4_ + 0.1)),auVar54);
    auVar127._0_8_ = auVar117._0_8_;
    auVar127._8_8_ = auVar127._0_8_;
    auVar196._8_8_ = auVar159._0_8_;
    auVar196._0_8_ = auVar159._0_8_;
    auVar214._8_8_ = auVar61._0_8_;
    auVar214._0_8_ = auVar61._0_8_;
    auVar42 = vshufpd_avx(auVar159,auVar159,3);
    auVar52 = vshufpd_avx(auVar61,auVar61,3);
    auVar53 = vshufps_avx(auVar59,auVar60,0);
    auVar58 = vsubps_avx512vl(auVar46,auVar53);
    fVar104 = auVar53._0_4_;
    auVar154._0_4_ = fVar104 * auVar63._0_4_;
    fVar204 = auVar53._4_4_;
    auVar154._4_4_ = fVar204 * auVar63._4_4_;
    fVar206 = auVar53._8_4_;
    auVar154._8_4_ = fVar206 * auVar63._8_4_;
    fVar208 = auVar53._12_4_;
    auVar154._12_4_ = fVar208 * auVar63._12_4_;
    auVar160._0_4_ = fVar104 * auVar42._0_4_;
    auVar160._4_4_ = fVar204 * auVar42._4_4_;
    auVar160._8_4_ = fVar206 * auVar42._8_4_;
    auVar160._12_4_ = fVar208 * auVar42._12_4_;
    auVar231._0_4_ = auVar52._0_4_ * fVar104;
    auVar231._4_4_ = auVar52._4_4_ * fVar204;
    auVar231._8_4_ = auVar52._8_4_ * fVar206;
    auVar231._12_4_ = auVar52._12_4_ * fVar208;
    auVar146._0_4_ = fVar104 * auVar66._0_4_;
    auVar146._4_4_ = fVar204 * auVar66._4_4_;
    auVar146._8_4_ = fVar206 * auVar66._8_4_;
    auVar146._12_4_ = fVar208 * auVar66._12_4_;
    auVar63 = vfmadd231ps_fma(auVar154,auVar58,auVar127);
    auVar66 = vfmadd231ps_fma(auVar160,auVar58,auVar196);
    auVar57 = vfmadd231ps_fma(auVar231,auVar58,auVar214);
    auVar58 = vfmadd231ps_fma(auVar146,auVar58,ZEXT816(0));
    auVar52 = vsubss_avx512f(auVar54,auVar59);
    auVar42 = vmovshdup_avx(auVar49);
    auVar117 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * auVar59._0_4_)),auVar49,auVar52);
    auVar52 = vsubss_avx512f(auVar54,auVar60);
    auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ * auVar60._0_4_)),auVar49,auVar52);
    auVar61 = vdivss_avx512f(auVar54,ZEXT416((uint)fVar210));
    auVar42 = vsubps_avx(auVar66,auVar63);
    auVar132 = auVar238._0_16_;
    auVar52 = vmulps_avx512vl(auVar42,auVar132);
    auVar42 = vsubps_avx(auVar57,auVar66);
    auVar53 = vmulps_avx512vl(auVar42,auVar132);
    auVar42 = vsubps_avx(auVar58,auVar57);
    auVar42 = vmulps_avx512vl(auVar42,auVar132);
    auVar49 = vminps_avx(auVar53,auVar42);
    auVar42 = vmaxps_avx(auVar53,auVar42);
    auVar49 = vminps_avx(auVar52,auVar49);
    auVar42 = vmaxps_avx(auVar52,auVar42);
    auVar52 = vshufpd_avx(auVar49,auVar49,3);
    auVar53 = vshufpd_avx(auVar42,auVar42,3);
    auVar49 = vminps_avx(auVar49,auVar52);
    auVar42 = vmaxps_avx(auVar42,auVar53);
    fVar210 = auVar61._0_4_;
    auVar179._0_4_ = auVar49._0_4_ * fVar210;
    auVar179._4_4_ = auVar49._4_4_ * fVar210;
    auVar179._8_4_ = auVar49._8_4_ * fVar210;
    auVar179._12_4_ = auVar49._12_4_ * fVar210;
    auVar169._0_4_ = fVar210 * auVar42._0_4_;
    auVar169._4_4_ = fVar210 * auVar42._4_4_;
    auVar169._8_4_ = fVar210 * auVar42._8_4_;
    auVar169._12_4_ = fVar210 * auVar42._12_4_;
    auVar61 = vdivss_avx512f(auVar54,ZEXT416((uint)(auVar55._0_4_ - auVar117._0_4_)));
    auVar42 = vshufpd_avx(auVar63,auVar63,3);
    auVar49 = vshufpd_avx(auVar66,auVar66,3);
    auVar52 = vshufpd_avx(auVar57,auVar57,3);
    auVar53 = vshufpd_avx(auVar58,auVar58,3);
    auVar42 = vsubps_avx(auVar42,auVar63);
    auVar63 = vsubps_avx(auVar49,auVar66);
    auVar66 = vsubps_avx(auVar52,auVar57);
    auVar53 = vsubps_avx(auVar53,auVar58);
    auVar49 = vminps_avx(auVar42,auVar63);
    auVar42 = vmaxps_avx(auVar42,auVar63);
    auVar52 = vminps_avx(auVar66,auVar53);
    auVar52 = vminps_avx(auVar49,auVar52);
    auVar49 = vmaxps_avx(auVar66,auVar53);
    auVar42 = vmaxps_avx(auVar42,auVar49);
    fVar210 = auVar61._0_4_;
    auVar215._0_4_ = fVar210 * auVar52._0_4_;
    auVar215._4_4_ = fVar210 * auVar52._4_4_;
    auVar215._8_4_ = fVar210 * auVar52._8_4_;
    auVar215._12_4_ = fVar210 * auVar52._12_4_;
    auVar197._0_4_ = fVar210 * auVar42._0_4_;
    auVar197._4_4_ = fVar210 * auVar42._4_4_;
    auVar197._8_4_ = fVar210 * auVar42._8_4_;
    auVar197._12_4_ = fVar210 * auVar42._12_4_;
    auVar53 = vinsertps_avx(auVar45,auVar117,0x10);
    auVar56 = vpermt2ps_avx512vl(auVar45,_DAT_01fb9f90,auVar55);
    auVar116._0_4_ = auVar53._0_4_ + auVar56._0_4_;
    auVar116._4_4_ = auVar53._4_4_ + auVar56._4_4_;
    auVar116._8_4_ = auVar53._8_4_ + auVar56._8_4_;
    auVar116._12_4_ = auVar53._12_4_ + auVar56._12_4_;
    auVar21._8_4_ = 0x3f000000;
    auVar21._0_8_ = 0x3f0000003f000000;
    auVar21._12_4_ = 0x3f000000;
    auVar61 = vmulps_avx512vl(auVar116,auVar21);
    auVar49 = vshufps_avx(auVar61,auVar61,0x54);
    uVar105 = auVar61._0_4_;
    auVar119._4_4_ = uVar105;
    auVar119._0_4_ = uVar105;
    auVar119._8_4_ = uVar105;
    auVar119._12_4_ = uVar105;
    auVar52 = vfmadd213ps_fma(auVar41,auVar119,auVar5);
    auVar63 = vfmadd213ps_fma(local_290,auVar119,auVar50);
    auVar66 = vfmadd213ps_fma(local_2a0,auVar119,auVar47);
    auVar42 = vsubps_avx(auVar63,auVar52);
    auVar52 = vfmadd213ps_fma(auVar42,auVar119,auVar52);
    auVar42 = vsubps_avx(auVar66,auVar63);
    auVar42 = vfmadd213ps_fma(auVar42,auVar119,auVar63);
    auVar42 = vsubps_avx(auVar42,auVar52);
    auVar52 = vfmadd231ps_fma(auVar52,auVar42,auVar119);
    auVar57 = vmulps_avx512vl(auVar42,auVar132);
    auVar223._8_8_ = auVar52._0_8_;
    auVar223._0_8_ = auVar52._0_8_;
    auVar42 = vshufpd_avx(auVar52,auVar52,3);
    auVar52 = vshufps_avx(auVar61,auVar61,0x55);
    auVar63 = vsubps_avx(auVar42,auVar223);
    auVar66 = vfmadd231ps_fma(auVar223,auVar52,auVar63);
    auVar232._8_8_ = auVar57._0_8_;
    auVar232._0_8_ = auVar57._0_8_;
    auVar42 = vshufpd_avx(auVar57,auVar57,3);
    auVar42 = vsubps_avx512vl(auVar42,auVar232);
    auVar42 = vfmadd213ps_avx512vl(auVar42,auVar52,auVar232);
    auVar120._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
    auVar120._8_4_ = auVar63._8_4_ ^ 0x80000000;
    auVar120._12_4_ = auVar63._12_4_ ^ 0x80000000;
    auVar52 = vmovshdup_avx512vl(auVar42);
    auVar233._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
    auVar233._8_4_ = auVar52._8_4_ ^ 0x80000000;
    auVar233._12_4_ = auVar52._12_4_ ^ 0x80000000;
    auVar57 = vmovshdup_avx512vl(auVar63);
    auVar58 = vpermt2ps_avx512vl(auVar233,ZEXT416(5),auVar63);
    auVar62 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
    auVar246 = ZEXT1664(auVar62);
    auVar52 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar52._0_4_ * auVar63._0_4_)),auVar42,auVar57);
    auVar63 = vpermt2ps_avx512vl(auVar42,SUB6416(ZEXT464(4),0),auVar120);
    auVar147._0_4_ = auVar52._0_4_;
    auVar147._4_4_ = auVar147._0_4_;
    auVar147._8_4_ = auVar147._0_4_;
    auVar147._12_4_ = auVar147._0_4_;
    auVar42 = vdivps_avx(auVar58,auVar147);
    auVar64 = vdivps_avx512vl(auVar63,auVar147);
    fVar210 = auVar66._0_4_;
    auVar52 = vshufps_avx(auVar66,auVar66,0x55);
    auVar224._0_4_ = fVar210 * auVar42._0_4_ + auVar52._0_4_ * auVar64._0_4_;
    auVar224._4_4_ = fVar210 * auVar42._4_4_ + auVar52._4_4_ * auVar64._4_4_;
    auVar224._8_4_ = fVar210 * auVar42._8_4_ + auVar52._8_4_ * auVar64._8_4_;
    auVar224._12_4_ = fVar210 * auVar42._12_4_ + auVar52._12_4_ * auVar64._12_4_;
    auVar59 = vsubps_avx(auVar49,auVar224);
    auVar52 = vmovshdup_avx(auVar42);
    auVar49 = vinsertps_avx(auVar179,auVar215,0x1c);
    auVar234._0_4_ = auVar52._0_4_ * auVar49._0_4_;
    auVar234._4_4_ = auVar52._4_4_ * auVar49._4_4_;
    auVar234._8_4_ = auVar52._8_4_ * auVar49._8_4_;
    auVar234._12_4_ = auVar52._12_4_ * auVar49._12_4_;
    auVar60 = vinsertps_avx512f(auVar169,auVar197,0x1c);
    auVar52 = vmulps_avx512vl(auVar52,auVar60);
    auVar58 = vminps_avx512vl(auVar234,auVar52);
    auVar66 = vmaxps_avx(auVar52,auVar234);
    auVar57 = vmovshdup_avx(auVar64);
    auVar52 = vinsertps_avx(auVar215,auVar179,0x4c);
    auVar216._0_4_ = auVar57._0_4_ * auVar52._0_4_;
    auVar216._4_4_ = auVar57._4_4_ * auVar52._4_4_;
    auVar216._8_4_ = auVar57._8_4_ * auVar52._8_4_;
    auVar216._12_4_ = auVar57._12_4_ * auVar52._12_4_;
    auVar63 = vinsertps_avx(auVar197,auVar169,0x4c);
    auVar198._0_4_ = auVar57._0_4_ * auVar63._0_4_;
    auVar198._4_4_ = auVar57._4_4_ * auVar63._4_4_;
    auVar198._8_4_ = auVar57._8_4_ * auVar63._8_4_;
    auVar198._12_4_ = auVar57._12_4_ * auVar63._12_4_;
    auVar57 = vminps_avx(auVar216,auVar198);
    auVar58 = vaddps_avx512vl(auVar58,auVar57);
    auVar57 = vmaxps_avx(auVar198,auVar216);
    auVar199._0_4_ = auVar66._0_4_ + auVar57._0_4_;
    auVar199._4_4_ = auVar66._4_4_ + auVar57._4_4_;
    auVar199._8_4_ = auVar66._8_4_ + auVar57._8_4_;
    auVar199._12_4_ = auVar66._12_4_ + auVar57._12_4_;
    auVar217._8_8_ = 0x3f80000000000000;
    auVar217._0_8_ = 0x3f80000000000000;
    auVar66 = vsubps_avx(auVar217,auVar199);
    auVar57 = vsubps_avx(auVar217,auVar58);
    auVar58 = vsubps_avx(auVar53,auVar61);
    auVar61 = vsubps_avx(auVar56,auVar61);
    fVar208 = auVar58._0_4_;
    auVar235._0_4_ = fVar208 * auVar66._0_4_;
    fVar209 = auVar58._4_4_;
    auVar235._4_4_ = fVar209 * auVar66._4_4_;
    fVar193 = auVar58._8_4_;
    auVar235._8_4_ = fVar193 * auVar66._8_4_;
    fVar207 = auVar58._12_4_;
    auVar235._12_4_ = fVar207 * auVar66._12_4_;
    auVar65 = vbroadcastss_avx512vl(auVar42);
    auVar49 = vmulps_avx512vl(auVar65,auVar49);
    auVar60 = vmulps_avx512vl(auVar65,auVar60);
    auVar65 = vminps_avx512vl(auVar49,auVar60);
    auVar60 = vmaxps_avx512vl(auVar60,auVar49);
    auVar49 = vbroadcastss_avx512vl(auVar64);
    auVar52 = vmulps_avx512vl(auVar49,auVar52);
    auVar49 = vmulps_avx512vl(auVar49,auVar63);
    auVar63 = vminps_avx512vl(auVar52,auVar49);
    auVar63 = vaddps_avx512vl(auVar65,auVar63);
    auVar58 = vmulps_avx512vl(auVar58,auVar57);
    fVar210 = auVar61._0_4_;
    auVar200._0_4_ = fVar210 * auVar66._0_4_;
    fVar104 = auVar61._4_4_;
    auVar200._4_4_ = fVar104 * auVar66._4_4_;
    fVar204 = auVar61._8_4_;
    auVar200._8_4_ = fVar204 * auVar66._8_4_;
    fVar206 = auVar61._12_4_;
    auVar200._12_4_ = fVar206 * auVar66._12_4_;
    auVar218._0_4_ = fVar210 * auVar57._0_4_;
    auVar218._4_4_ = fVar104 * auVar57._4_4_;
    auVar218._8_4_ = fVar204 * auVar57._8_4_;
    auVar218._12_4_ = fVar206 * auVar57._12_4_;
    auVar49 = vmaxps_avx(auVar49,auVar52);
    auVar170._0_4_ = auVar60._0_4_ + auVar49._0_4_;
    auVar170._4_4_ = auVar60._4_4_ + auVar49._4_4_;
    auVar170._8_4_ = auVar60._8_4_ + auVar49._8_4_;
    auVar170._12_4_ = auVar60._12_4_ + auVar49._12_4_;
    auVar180._8_8_ = 0x3f800000;
    auVar180._0_8_ = 0x3f800000;
    auVar49 = vsubps_avx(auVar180,auVar170);
    auVar52 = vsubps_avx512vl(auVar180,auVar63);
    auVar228._0_4_ = fVar208 * auVar49._0_4_;
    auVar228._4_4_ = fVar209 * auVar49._4_4_;
    auVar228._8_4_ = fVar193 * auVar49._8_4_;
    auVar228._12_4_ = fVar207 * auVar49._12_4_;
    auVar225._0_4_ = fVar208 * auVar52._0_4_;
    auVar225._4_4_ = fVar209 * auVar52._4_4_;
    auVar225._8_4_ = fVar193 * auVar52._8_4_;
    auVar225._12_4_ = fVar207 * auVar52._12_4_;
    auVar171._0_4_ = fVar210 * auVar49._0_4_;
    auVar171._4_4_ = fVar104 * auVar49._4_4_;
    auVar171._8_4_ = fVar204 * auVar49._8_4_;
    auVar171._12_4_ = fVar206 * auVar49._12_4_;
    auVar181._0_4_ = fVar210 * auVar52._0_4_;
    auVar181._4_4_ = fVar104 * auVar52._4_4_;
    auVar181._8_4_ = fVar204 * auVar52._8_4_;
    auVar181._12_4_ = fVar206 * auVar52._12_4_;
    auVar49 = vminps_avx(auVar228,auVar225);
    auVar52 = vminps_avx512vl(auVar171,auVar181);
    auVar237 = ZEXT1664(auVar52);
    auVar63 = vminps_avx512vl(auVar49,auVar52);
    auVar49 = vmaxps_avx(auVar225,auVar228);
    auVar52 = vmaxps_avx(auVar181,auVar171);
    auVar52 = vmaxps_avx(auVar52,auVar49);
    auVar66 = vminps_avx512vl(auVar235,auVar58);
    auVar49 = vminps_avx(auVar200,auVar218);
    auVar49 = vminps_avx(auVar66,auVar49);
    auVar49 = vhaddps_avx(auVar63,auVar49);
    auVar66 = vmaxps_avx512vl(auVar58,auVar235);
    auVar63 = vmaxps_avx(auVar218,auVar200);
    auVar63 = vmaxps_avx(auVar63,auVar66);
    auVar52 = vhaddps_avx(auVar52,auVar63);
    auVar49 = vshufps_avx(auVar49,auVar49,0xe8);
    auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
    auVar172._0_4_ = auVar49._0_4_ + auVar59._0_4_;
    auVar172._4_4_ = auVar49._4_4_ + auVar59._4_4_;
    auVar172._8_4_ = auVar49._8_4_ + auVar59._8_4_;
    auVar172._12_4_ = auVar49._12_4_ + auVar59._12_4_;
    auVar182._0_4_ = auVar52._0_4_ + auVar59._0_4_;
    auVar182._4_4_ = auVar52._4_4_ + auVar59._4_4_;
    auVar182._8_4_ = auVar52._8_4_ + auVar59._8_4_;
    auVar182._12_4_ = auVar52._12_4_ + auVar59._12_4_;
    auVar49 = vmaxps_avx(auVar53,auVar172);
    auVar52 = vminps_avx(auVar182,auVar56);
    uVar2 = vcmpps_avx512vl(auVar52,auVar49,1);
  } while ((uVar2 & 3) != 0);
  uVar2 = vcmpps_avx512vl(auVar182,auVar56,1);
  uVar17 = vcmpps_avx512vl(auVar45,auVar172,1);
  if (((ushort)uVar17 & (ushort)uVar2 & 1) == 0) {
    bVar29 = 0;
  }
  else {
    auVar49 = vmovshdup_avx(auVar172);
    bVar29 = auVar117._0_4_ < auVar49._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar31 || uVar7 != 0 && !bVar39) | bVar29) != 1) goto LAB_01a33465;
  lVar33 = 0xc9;
  do {
    lVar33 = lVar33 + -1;
    if (lVar33 == 0) goto LAB_01a325b4;
    auVar45 = vsubss_avx512f(auVar54,auVar59);
    fVar204 = auVar45._0_4_;
    fVar210 = fVar204 * fVar204 * fVar204;
    fVar206 = auVar59._0_4_;
    fVar104 = fVar206 * 3.0 * fVar204 * fVar204;
    fVar204 = fVar204 * fVar206 * fVar206 * 3.0;
    auVar134._4_4_ = fVar210;
    auVar134._0_4_ = fVar210;
    auVar134._8_4_ = fVar210;
    auVar134._12_4_ = fVar210;
    auVar128._4_4_ = fVar104;
    auVar128._0_4_ = fVar104;
    auVar128._8_4_ = fVar104;
    auVar128._12_4_ = fVar104;
    auVar109._4_4_ = fVar204;
    auVar109._0_4_ = fVar204;
    auVar109._8_4_ = fVar204;
    auVar109._12_4_ = fVar204;
    fVar206 = fVar206 * fVar206 * fVar206;
    auVar155._0_4_ = (float)local_2b0._0_4_ * fVar206;
    auVar155._4_4_ = (float)local_2b0._4_4_ * fVar206;
    auVar155._8_4_ = fStack_2a8 * fVar206;
    auVar155._12_4_ = fStack_2a4 * fVar206;
    auVar45 = vfmadd231ps_fma(auVar155,auVar47,auVar109);
    auVar45 = vfmadd231ps_fma(auVar45,auVar50,auVar128);
    auVar45 = vfmadd231ps_fma(auVar45,auVar5,auVar134);
    auVar110._8_8_ = auVar45._0_8_;
    auVar110._0_8_ = auVar45._0_8_;
    auVar45 = vshufpd_avx(auVar45,auVar45,3);
    auVar49 = vshufps_avx(auVar59,auVar59,0x55);
    auVar45 = vsubps_avx(auVar45,auVar110);
    auVar49 = vfmadd213ps_fma(auVar45,auVar49,auVar110);
    fVar210 = auVar49._0_4_;
    auVar45 = vshufps_avx(auVar49,auVar49,0x55);
    auVar111._0_4_ = auVar42._0_4_ * fVar210 + auVar64._0_4_ * auVar45._0_4_;
    auVar111._4_4_ = auVar42._4_4_ * fVar210 + auVar64._4_4_ * auVar45._4_4_;
    auVar111._8_4_ = auVar42._8_4_ * fVar210 + auVar64._8_4_ * auVar45._8_4_;
    auVar111._12_4_ = auVar42._12_4_ * fVar210 + auVar64._12_4_ * auVar45._12_4_;
    auVar59 = vsubps_avx(auVar59,auVar111);
    auVar45 = vandps_avx512vl(auVar49,auVar240._0_16_);
    auVar49 = vprolq_avx512vl(auVar45,0x20);
    auVar45 = vmaxss_avx(auVar49,auVar45);
    bVar39 = (float)local_2c0._0_4_ < auVar45._0_4_;
  } while ((float)local_2c0._0_4_ <= auVar45._0_4_);
  auVar45 = vucomiss_avx512f(auVar62);
  if (bVar39) goto LAB_01a325b4;
  auVar42 = vucomiss_avx512f(auVar45);
  auVar247 = ZEXT1664(auVar42);
  if (bVar39) goto LAB_01a325b4;
  vmovshdup_avx(auVar45);
  auVar42 = vucomiss_avx512f(auVar62);
  if (bVar39) goto LAB_01a325b4;
  auVar49 = vucomiss_avx512f(auVar42);
  auVar247 = ZEXT1664(auVar49);
  if (bVar39) goto LAB_01a325b4;
  auVar54 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar61 = vinsertps_avx(auVar54,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar54 = vdpps_avx(auVar61,local_2d0,0x7f);
  auVar52 = vdpps_avx(auVar61,local_2e0,0x7f);
  auVar53 = vdpps_avx(auVar61,local_2f0,0x7f);
  auVar63 = vdpps_avx(auVar61,local_300,0x7f);
  auVar66 = vdpps_avx(auVar61,local_310,0x7f);
  auVar57 = vdpps_avx(auVar61,local_320,0x7f);
  auVar58 = vdpps_avx(auVar61,local_330,0x7f);
  auVar61 = vdpps_avx(auVar61,local_340,0x7f);
  auVar59 = vsubss_avx512f(auVar49,auVar42);
  fVar210 = auVar42._0_4_;
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar66._0_4_)),auVar59,auVar54);
  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * fVar210)),auVar59,auVar52);
  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar210)),auVar59,auVar53);
  auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar61._0_4_)),auVar59,auVar63);
  auVar49 = vsubss_avx512f(auVar49,auVar45);
  auVar156._0_4_ = auVar49._0_4_;
  fVar210 = auVar156._0_4_ * auVar156._0_4_ * auVar156._0_4_;
  local_120 = auVar45._0_4_;
  fVar104 = local_120 * 3.0 * auVar156._0_4_ * auVar156._0_4_;
  fVar204 = auVar156._0_4_ * local_120 * local_120 * 3.0;
  fVar206 = local_120 * local_120 * local_120;
  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar53._0_4_)),ZEXT416((uint)fVar204),auVar52)
  ;
  auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar104),auVar54);
  vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar210),auVar42);
  auVar42 = vucomiss_avx512f(ZEXT416(uVar1));
  if (bVar39) goto LAB_01a325b4;
  fVar208 = *(float *)(ray + k * 4 + 0x100);
  if (fVar208 < auVar42._0_4_) goto LAB_01a325b4;
  auVar49 = vshufps_avx(auVar45,auVar45,0x55);
  auVar52 = vsubps_avx512vl(auVar46,auVar49);
  fVar209 = auVar49._0_4_;
  auVar183._0_4_ = fVar209 * (float)local_360._0_4_;
  fVar193 = auVar49._4_4_;
  auVar183._4_4_ = fVar193 * (float)local_360._4_4_;
  fVar207 = auVar49._8_4_;
  auVar183._8_4_ = fVar207 * fStack_358;
  fVar211 = auVar49._12_4_;
  auVar183._12_4_ = fVar211 * fStack_354;
  auVar189._0_4_ = fVar209 * (float)local_3b0._0_4_;
  auVar189._4_4_ = fVar193 * (float)local_3b0._4_4_;
  auVar189._8_4_ = fVar207 * fStack_3a8;
  auVar189._12_4_ = fVar211 * fStack_3a4;
  auVar201._0_4_ = fVar209 * (float)local_3c0._0_4_;
  auVar201._4_4_ = fVar193 * (float)local_3c0._4_4_;
  auVar201._8_4_ = fVar207 * fStack_3b8;
  auVar201._12_4_ = fVar211 * fStack_3b4;
  auVar161._0_4_ = fVar209 * (float)local_380._0_4_;
  auVar161._4_4_ = fVar193 * (float)local_380._4_4_;
  auVar161._8_4_ = fVar207 * fStack_378;
  auVar161._12_4_ = fVar211 * fStack_374;
  auVar46 = vfmadd231ps_fma(auVar183,auVar52,local_350);
  auVar49 = vfmadd231ps_fma(auVar189,auVar52,local_390);
  auVar54 = vfmadd231ps_fma(auVar201,auVar52,local_3a0);
  auVar52 = vfmadd231ps_fma(auVar161,auVar52,local_370);
  auVar46 = vsubps_avx(auVar49,auVar46);
  auVar49 = vsubps_avx(auVar54,auVar49);
  auVar54 = vsubps_avx(auVar52,auVar54);
  auVar202._0_4_ = local_120 * auVar49._0_4_;
  auVar202._4_4_ = local_120 * auVar49._4_4_;
  auVar202._8_4_ = local_120 * auVar49._8_4_;
  auVar202._12_4_ = local_120 * auVar49._12_4_;
  auVar156._4_4_ = auVar156._0_4_;
  auVar156._8_4_ = auVar156._0_4_;
  auVar156._12_4_ = auVar156._0_4_;
  auVar46 = vfmadd231ps_fma(auVar202,auVar156,auVar46);
  auVar162._0_4_ = local_120 * auVar54._0_4_;
  auVar162._4_4_ = local_120 * auVar54._4_4_;
  auVar162._8_4_ = local_120 * auVar54._8_4_;
  auVar162._12_4_ = local_120 * auVar54._12_4_;
  auVar49 = vfmadd231ps_fma(auVar162,auVar156,auVar49);
  auVar163._0_4_ = local_120 * auVar49._0_4_;
  auVar163._4_4_ = local_120 * auVar49._4_4_;
  auVar163._8_4_ = local_120 * auVar49._8_4_;
  auVar163._12_4_ = local_120 * auVar49._12_4_;
  auVar46 = vfmadd231ps_fma(auVar163,auVar156,auVar46);
  auVar46 = vmulps_avx512vl(auVar46,auVar132);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar29 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01a33448;
    auVar148._0_4_ = fVar206 * (float)local_400._0_4_;
    auVar148._4_4_ = fVar206 * (float)local_400._4_4_;
    auVar148._8_4_ = fVar206 * fStack_3f8;
    auVar148._12_4_ = fVar206 * fStack_3f4;
    auVar135._4_4_ = fVar204;
    auVar135._0_4_ = fVar204;
    auVar135._8_4_ = fVar204;
    auVar135._12_4_ = fVar204;
    auVar49 = vfmadd132ps_fma(auVar135,auVar148,local_3f0);
    auVar129._4_4_ = fVar104;
    auVar129._0_4_ = fVar104;
    auVar129._8_4_ = fVar104;
    auVar129._12_4_ = fVar104;
    auVar49 = vfmadd132ps_fma(auVar129,auVar49,local_3e0);
    auVar121._4_4_ = fVar210;
    auVar121._0_4_ = fVar210;
    auVar121._8_4_ = fVar210;
    auVar121._12_4_ = fVar210;
    auVar52 = vfmadd132ps_fma(auVar121,auVar49,local_3d0);
    auVar49 = vshufps_avx(auVar52,auVar52,0xc9);
    auVar54 = vshufps_avx(auVar46,auVar46,0xc9);
    auVar122._0_4_ = auVar52._0_4_ * auVar54._0_4_;
    auVar122._4_4_ = auVar52._4_4_ * auVar54._4_4_;
    auVar122._8_4_ = auVar52._8_4_ * auVar54._8_4_;
    auVar122._12_4_ = auVar52._12_4_ * auVar54._12_4_;
    auVar46 = vfmsub231ps_fma(auVar122,auVar46,auVar49);
    auVar138._8_4_ = 1;
    auVar138._0_8_ = 0x100000001;
    auVar138._12_4_ = 1;
    auVar138._16_4_ = 1;
    auVar138._20_4_ = 1;
    auVar138._24_4_ = 1;
    auVar138._28_4_ = 1;
    local_100 = vpermps_avx2(auVar138,ZEXT1632(auVar45));
    auVar74 = vpermps_avx2(auVar138,ZEXT1632(auVar46));
    local_160 = vpermps_avx512vl(auVar245._0_32_,ZEXT1632(auVar46));
    local_140 = auVar46._0_4_;
    local_180[0] = (RTCHitN)auVar74[0];
    local_180[1] = (RTCHitN)auVar74[1];
    local_180[2] = (RTCHitN)auVar74[2];
    local_180[3] = (RTCHitN)auVar74[3];
    local_180[4] = (RTCHitN)auVar74[4];
    local_180[5] = (RTCHitN)auVar74[5];
    local_180[6] = (RTCHitN)auVar74[6];
    local_180[7] = (RTCHitN)auVar74[7];
    local_180[8] = (RTCHitN)auVar74[8];
    local_180[9] = (RTCHitN)auVar74[9];
    local_180[10] = (RTCHitN)auVar74[10];
    local_180[0xb] = (RTCHitN)auVar74[0xb];
    local_180[0xc] = (RTCHitN)auVar74[0xc];
    local_180[0xd] = (RTCHitN)auVar74[0xd];
    local_180[0xe] = (RTCHitN)auVar74[0xe];
    local_180[0xf] = (RTCHitN)auVar74[0xf];
    local_180[0x10] = (RTCHitN)auVar74[0x10];
    local_180[0x11] = (RTCHitN)auVar74[0x11];
    local_180[0x12] = (RTCHitN)auVar74[0x12];
    local_180[0x13] = (RTCHitN)auVar74[0x13];
    local_180[0x14] = (RTCHitN)auVar74[0x14];
    local_180[0x15] = (RTCHitN)auVar74[0x15];
    local_180[0x16] = (RTCHitN)auVar74[0x16];
    local_180[0x17] = (RTCHitN)auVar74[0x17];
    local_180[0x18] = (RTCHitN)auVar74[0x18];
    local_180[0x19] = (RTCHitN)auVar74[0x19];
    local_180[0x1a] = (RTCHitN)auVar74[0x1a];
    local_180[0x1b] = (RTCHitN)auVar74[0x1b];
    local_180[0x1c] = (RTCHitN)auVar74[0x1c];
    local_180[0x1d] = (RTCHitN)auVar74[0x1d];
    local_180[0x1e] = (RTCHitN)auVar74[0x1e];
    local_180[0x1f] = (RTCHitN)auVar74[0x1f];
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_e0 = local_1e0._0_8_;
    uStack_d8 = local_1e0._8_8_;
    uStack_d0 = local_1e0._16_8_;
    uStack_c8 = local_1e0._24_8_;
    local_c0 = local_200;
    vpcmpeqd_avx2(local_200,local_200);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = auVar42._0_4_;
    local_420 = local_220;
    local_450.valid = (int *)local_420;
    local_450.geometryUserPtr = pGVar8->userPtr;
    local_450.context = context->user;
    local_450.ray = (RTCRayN *)ray;
    local_450.hit = local_180;
    local_450.N = 8;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&local_450);
      auVar45 = vxorps_avx512vl(auVar62,auVar62);
      auVar246 = ZEXT1664(auVar45);
      auVar247 = ZEXT464(0x3f800000);
      auVar244 = ZEXT3264(_DAT_01fb9fe0);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar243 = ZEXT1664(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar242 = ZEXT1664(auVar45);
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar239 = ZEXT3264(auVar74);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar241 = ZEXT1664(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar240 = ZEXT1664(auVar45);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar238 = ZEXT1664(auVar45);
      auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar245 = ZEXT3264(auVar74);
    }
    auVar45 = auVar246._0_16_;
    if (local_420 != (undefined1  [32])0x0) {
      p_Var11 = context->args->filter;
      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var11)(&local_450);
        auVar45 = vxorps_avx512vl(auVar45,auVar45);
        auVar246 = ZEXT1664(auVar45);
        auVar247 = ZEXT464(0x3f800000);
        auVar244 = ZEXT3264(_DAT_01fb9fe0);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar243 = ZEXT1664(auVar45);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar242 = ZEXT1664(auVar45);
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar239 = ZEXT3264(auVar74);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar241 = ZEXT1664(auVar45);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar240 = ZEXT1664(auVar45);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar238 = ZEXT1664(auVar45);
        auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
        auVar245 = ZEXT3264(auVar74);
      }
      uVar2 = vptestmd_avx512vl(local_420,local_420);
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar39 = (bool)((byte)uVar2 & 1);
      bVar40 = (bool)((byte)(uVar2 >> 1) & 1);
      bVar37 = (bool)((byte)(uVar2 >> 2) & 1);
      bVar38 = (bool)((byte)(uVar2 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar2 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar2 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar2 >> 6) & 1);
      bVar16 = SUB81(uVar2 >> 7,0);
      *(uint *)(local_450.ray + 0x100) =
           (uint)bVar39 * auVar74._0_4_ | (uint)!bVar39 * *(int *)(local_450.ray + 0x100);
      *(uint *)(local_450.ray + 0x104) =
           (uint)bVar40 * auVar74._4_4_ | (uint)!bVar40 * *(int *)(local_450.ray + 0x104);
      *(uint *)(local_450.ray + 0x108) =
           (uint)bVar37 * auVar74._8_4_ | (uint)!bVar37 * *(int *)(local_450.ray + 0x108);
      *(uint *)(local_450.ray + 0x10c) =
           (uint)bVar38 * auVar74._12_4_ | (uint)!bVar38 * *(int *)(local_450.ray + 0x10c);
      *(uint *)(local_450.ray + 0x110) =
           (uint)bVar13 * auVar74._16_4_ | (uint)!bVar13 * *(int *)(local_450.ray + 0x110);
      *(uint *)(local_450.ray + 0x114) =
           (uint)bVar14 * auVar74._20_4_ | (uint)!bVar14 * *(int *)(local_450.ray + 0x114);
      *(uint *)(local_450.ray + 0x118) =
           (uint)bVar15 * auVar74._24_4_ | (uint)!bVar15 * *(int *)(local_450.ray + 0x118);
      *(uint *)(local_450.ray + 0x11c) =
           (uint)bVar16 * auVar74._28_4_ | (uint)!bVar16 * *(int *)(local_450.ray + 0x11c);
      bVar29 = 1;
      if (local_420 != (undefined1  [32])0x0) goto LAB_01a33448;
    }
    *(float *)(ray + k * 4 + 0x100) = fVar208;
  }
  bVar29 = 0;
LAB_01a33448:
  bVar12 = (bool)(bVar12 | bVar29);
  goto LAB_01a325b4;
LAB_01a33465:
  auVar49 = vinsertps_avx(auVar117,auVar55,0x10);
  goto LAB_01a320b9;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }